

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O3

idx_t duckdb::TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  PhysicalType PVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  SelectionVector *pSVar4;
  data_t *pdVar5;
  short *psVar6;
  data_ptr_t pdVar7;
  sel_t *psVar8;
  data_ptr_t pdVar9;
  sel_t *psVar10;
  sel_t *psVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined1 auVar15 [8];
  undefined8 uVar16;
  SelectionVector *pSVar17;
  ulong uVar18;
  _Head_base<0UL,_unsigned_long_*,_false> _Var19;
  Vector *pVVar20;
  idx_t iVar21;
  element_type *peVar22;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  int *piVar24;
  element_type *peVar25;
  reference pvVar26;
  type pVVar27;
  UnifiedVectorFormat *pUVar28;
  idx_t iVar29;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar30;
  TemplatedValidityData<unsigned_long> *pTVar31;
  element_type *peVar32;
  NotImplementedException *this_01;
  InternalException *this_02;
  ulong uVar33;
  optional_ptr<duckdb::SelectionVector,_true> oVar34;
  ulong uVar35;
  int *piVar36;
  optional_ptr<duckdb::ValidityMask,_true> oVar37;
  long lVar38;
  idx_t iVar39;
  undefined4 uVar40;
  idx_t idx_in_entry;
  idx_t iVar41;
  float *pfVar42;
  double *pdVar43;
  string_t *psVar44;
  uhugeint_t *puVar45;
  int iVar46;
  idx_t pos;
  element_type *peVar47;
  long *plVar48;
  long *plVar49;
  float *pfVar50;
  double *pdVar51;
  string_t *psVar52;
  uhugeint_t *puVar53;
  sel_t sVar54;
  size_type __n;
  long lVar55;
  ulong uVar56;
  long lVar57;
  long lVar58;
  ulong uVar59;
  long lVar60;
  long lVar61;
  int iVar62;
  idx_t pos_1;
  ulong uVar63;
  bool bVar64;
  bool bVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  interval_t *left_1;
  UnifiedVectorFormat lvdata;
  UnifiedVectorFormat rvdata;
  SelectionVector slice_sel;
  SelectionVector rcursor;
  SelectionVector lcursor;
  SelectionVector maybe_vec;
  ValidityMask child_validity;
  SelectionVector true_sel_1;
  Vector lchild;
  Vector rchild;
  UnifiedVectorFormat rvdata_1;
  SelectionVector false_sel_1;
  OptionalSelection false_opt;
  UnifiedVectorFormat lvdata_1;
  OptionalSelection true_opt;
  SelectionVector false_vec;
  SelectionVector true_vec;
  Vector l_not_null;
  Vector r_not_null;
  long local_4c8;
  element_type *local_4b8;
  long local_4a8;
  undefined1 local_498 [8];
  LogicalType LStack_490;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_478;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_438;
  optional_ptr<duckdb::ValidityMask,_true> local_430;
  undefined1 local_428 [8];
  LogicalType LStack_420;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c8;
  element_type *local_3b8;
  optional_ptr<duckdb::ValidityMask,_true> local_3b0;
  SelectionVector local_3a8;
  SelectionVector local_390;
  SelectionVector local_378;
  SelectionVector local_360;
  undefined1 local_348 [56];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_310;
  Vector local_308;
  optional_ptr<duckdb::SelectionVector,_true> local_2a0;
  optional_ptr<duckdb::SelectionVector,_true> local_298;
  optional_ptr<const_duckdb::SelectionVector,_true> local_290;
  undefined1 local_288 [8];
  LogicalType aLStack_280 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  UnifiedVectorFormat local_220;
  SelectionVector local_1d8;
  OptionalSelection local_1c0;
  element_type *local_1a0;
  UnifiedVectorFormat local_198;
  OptionalSelection local_150;
  SelectionVector local_130;
  SelectionVector local_118;
  Vector local_100;
  Vector local_98;
  
  PVar1 = (left->type).physical_type_;
  if (199 < PVar1) {
    if (PVar1 == VARCHAR) {
      local_288 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
        UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
        UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          psVar44 = (string_t *)left->data;
          psVar52 = (string_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            lVar38 = 0;
            local_4b8 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = string_t::operator==(psVar44,psVar52);
                bVar64 = !bVar64;
              }
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
              psVar44 = psVar44 + 1;
              psVar52 = psVar52 + 1;
            } while (count != uVar56);
            return (idx_t)local_4b8;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            uVar56 = 0;
            local_4b8 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = string_t::operator==(psVar44,psVar52);
                bVar64 = !bVar64;
              }
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
              psVar44 = psVar44 + 1;
              psVar52 = psVar52 + 1;
            } while (count != uVar56);
            return (idx_t)local_4b8;
          }
          if (count != 0) {
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65 ^ 1);
              }
              else {
                bVar64 = string_t::operator==(psVar44,psVar52);
              }
              (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)bVar64;
              uVar56 = uVar56 + 1;
              psVar44 = psVar44 + 1;
              psVar52 = psVar52 + 1;
            } while (count != uVar56);
            goto LAB_00b32886;
          }
          goto LAB_00b32883;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          psVar44 = (string_t *)right->data;
          puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar52 = (string_t *)left->data;
          _local_498 = (undefined1  [16])0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
            local_308._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_428,(unsigned_long *)&local_308);
            peVar32 = LStack_490.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar15 = local_428;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_420._0_8_;
            _local_428 = (undefined1  [16])0x0;
            auVar13 = _local_428;
            local_428[0] = auVar15[0];
            local_428[1] = auVar15[1];
            local_428._2_6_ = auVar15._2_6_;
            LStack_490.id_ = local_428[0];
            LStack_490.physical_type_ = local_428[1];
            LStack_490._2_6_ = local_428._2_6_;
            _local_428 = auVar13;
            if (peVar32 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
              }
            }
            pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_498 + 8));
            local_498 = *(undefined1 (*) [8])
                         &(pTVar31->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>;
            *(undefined8 *)local_498 = 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(left);
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b3397e;
              lVar38 = 0;
              uVar56 = 0;
              do {
                uVar35 = uVar56;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar64 = false;
                }
                else {
                  bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar65 = false;
                }
                else {
                  bVar65 = (*(byte *)local_498 & 1) == 0;
                }
                if ((bVar64 | bVar65) == 1) {
                  bVar64 = (bool)(bVar64 ^ bVar65 ^ 1);
                }
                else {
                  bVar64 = string_t::operator==(psVar52,psVar44);
                }
                (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
                lVar38 = lVar38 + (ulong)bVar64;
                uVar56 = uVar56 + 1;
                psVar52 = psVar52 + 1;
              } while (count != uVar56);
              goto LAB_00b33981;
            }
            if (count != 0) {
              uVar56 = 0;
              local_4b8 = (element_type *)0x0;
              do {
                uVar35 = uVar56;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar64 = false;
                }
                else {
                  bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar65 = false;
                }
                else {
                  bVar65 = (*(byte *)local_498 & 1) == 0;
                }
                if ((bVar64 | bVar65) == 1) {
                  bVar64 = (bool)(bVar64 ^ bVar65);
                }
                else {
                  bVar64 = string_t::operator==(psVar52,psVar44);
                  bVar64 = !bVar64;
                }
                (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
                local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
                uVar56 = uVar56 + 1;
                psVar52 = psVar52 + 1;
                local_478._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     LStack_490.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              } while (count != uVar56);
              goto LAB_00b33993;
            }
          }
          else if (count != 0) {
            lVar38 = 0;
            local_4b8 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = string_t::operator==(psVar52,psVar44);
                bVar64 = !bVar64;
              }
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
              psVar52 = psVar52 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar56);
            goto LAB_00b33993;
          }
          goto LAB_00b2fecd;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          psVar44 = (string_t *)left->data;
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar52 = (string_t *)right->data;
          _local_498 = (undefined1  [16])0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
            local_308._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_428,(unsigned_long *)&local_308);
            peVar32 = LStack_490.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar15 = local_428;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_420._0_8_;
            _local_428 = (undefined1  [16])0x0;
            auVar13 = _local_428;
            local_428[0] = auVar15[0];
            local_428[1] = auVar15[1];
            local_428._2_6_ = auVar15._2_6_;
            LStack_490.id_ = local_428[0];
            LStack_490.physical_type_ = local_428[1];
            LStack_490._2_6_ = local_428._2_6_;
            _local_428 = auVar13;
            if (peVar32 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
              }
            }
            pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_498 + 8));
            local_498 = *(undefined1 (*) [8])
                         &(pTVar31->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>;
            *(undefined8 *)local_498 = 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b3397e;
              lVar38 = 0;
              uVar56 = 0;
              do {
                uVar35 = uVar56;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar64 = false;
                }
                else {
                  bVar64 = (*(byte *)local_498 & 1) == 0;
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar65 = false;
                }
                else {
                  bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
                }
                if ((bVar64 | bVar65) == 1) {
                  bVar64 = (bool)(bVar64 ^ bVar65 ^ 1);
                }
                else {
                  bVar64 = string_t::operator==(psVar44,psVar52);
                }
                (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
                lVar38 = lVar38 + (ulong)bVar64;
                uVar56 = uVar56 + 1;
                psVar52 = psVar52 + 1;
              } while (count != uVar56);
              goto LAB_00b33981;
            }
            if (count != 0) {
              uVar56 = 0;
              local_4b8 = (element_type *)0x0;
              do {
                uVar35 = uVar56;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar64 = false;
                }
                else {
                  bVar64 = (*(byte *)local_498 & 1) == 0;
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar65 = false;
                }
                else {
                  bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
                }
                if ((bVar64 | bVar65) == 1) {
                  bVar64 = (bool)(bVar64 ^ bVar65);
                }
                else {
                  bVar64 = string_t::operator==(psVar44,psVar52);
                  bVar64 = !bVar64;
                }
                (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
                local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
                uVar56 = uVar56 + 1;
                psVar52 = psVar52 + 1;
                local_478._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     LStack_490.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              } while (count != uVar56);
              goto LAB_00b33993;
            }
          }
          else if (count != 0) {
            lVar38 = 0;
            local_4b8 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = string_t::operator==(psVar44,psVar52);
                bVar64 = !bVar64;
              }
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
              psVar52 = psVar52 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar56);
            goto LAB_00b33993;
          }
          goto LAB_00b2fecd;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar2 == (unsigned_long *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*puVar2 & 1) == 0;
          }
          if (puVar3 == (unsigned_long *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = (*puVar3 & 1) == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            if (bVar64 != bVar65) {
LAB_00b31c96:
              if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
                psVar10 = (sel.ptr)->sel_vector;
                psVar11 = (true_sel.ptr)->sel_vector;
                iVar39 = 0;
                do {
                  sVar54 = (sel_t)iVar39;
                  if (psVar10 != (sel_t *)0x0) {
                    sVar54 = psVar10[iVar39];
                  }
                  psVar11[iVar39] = sVar54;
                  iVar39 = iVar39 + 1;
                } while (count != iVar39);
                return count;
              }
              return count;
            }
          }
          else {
            bVar64 = string_t::operator==((string_t *)left->data,(string_t *)right->data);
            if (!bVar64) goto LAB_00b31c96;
          }
          if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          iVar39 = 0;
          do {
            sVar54 = (sel_t)iVar39;
            if (psVar10 != (sel_t *)0x0) {
              sVar54 = psVar10[iVar39];
            }
            psVar11[iVar39] = sVar54;
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
          return (idx_t)(element_type *)0x0;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
      Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
      Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
      uVar14 = LStack_490._0_8_;
      uVar16 = LStack_420._0_8_;
      if (LStack_420.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0 &&
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count != 0) {
              psVar10 = (sel.ptr)->sel_vector;
              lVar38 = *(long *)local_498;
              psVar11 = *(sel_t **)local_428;
              lVar57 = 0;
              iVar39 = 0;
              do {
                iVar21 = iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  iVar21 = (idx_t)psVar10[iVar39];
                }
                iVar29 = iVar39;
                if (lVar38 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
                }
                iVar41 = iVar39;
                if (psVar11 != (sel_t *)0x0) {
                  iVar41 = (idx_t)psVar11[iVar39];
                }
                bVar64 = string_t::operator==
                                   ((string_t *)(uVar14 + iVar29 * 0x10),
                                    (string_t *)(uVar16 + iVar41 * 0x10));
                if (bVar64) {
                  (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
                  lVar57 = lVar57 + 1;
                }
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              goto LAB_00b31188;
            }
            goto LAB_00b31186;
          }
          if (count == 0) goto LAB_00b2ba44;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          iVar39 = 0;
          local_4b8 = (element_type *)0x0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            bVar64 = string_t::operator==
                               ((string_t *)(uVar14 + iVar29 * 0x10),
                                (string_t *)(uVar16 + iVar41 * 0x10));
            if (!bVar64) {
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
        }
        else {
          if (count == 0) goto LAB_00b2ba44;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          peVar32 = (element_type *)0x0;
          local_4b8 = (element_type *)0x0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            bVar64 = string_t::operator==
                               ((string_t *)(uVar14 + iVar29 * 0x10),
                                (string_t *)(uVar16 + iVar41 * 0x10));
            if (bVar64) {
              peVar25 = peVar32;
              oVar34.ptr = false_sel.ptr;
              peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            }
            else {
              peVar25 = local_4b8;
              oVar34.ptr = true_sel.ptr;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
            }
            (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)iVar21;
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
        }
      }
      else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b31186;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          lVar57 = 0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                       == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              if (bVar64 == bVar65) {
LAB_00b30ffd:
                (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
                lVar57 = lVar57 + 1;
              }
            }
            else {
              bVar64 = string_t::operator==
                                 ((string_t *)(uVar14 + iVar29 * 0x10),
                                  (string_t *)(uVar16 + iVar41 * 0x10));
              if (bVar64) goto LAB_00b30ffd;
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
          goto LAB_00b31188;
        }
        if (count == 0) goto LAB_00b2ba44;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        local_4b8 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            if (bVar64 != bVar65) {
LAB_00b2b87f:
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
            }
          }
          else {
            bVar64 = string_t::operator==
                               ((string_t *)(uVar14 + iVar29 * 0x10),
                                (string_t *)(uVar16 + iVar41 * 0x10));
            if (!bVar64) goto LAB_00b2b87f;
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
      }
      else {
        if (count == 0) goto LAB_00b2ba44;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        local_4b8 = (element_type *)0x0;
        iVar39 = 0;
        peVar32 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            if (bVar64 == bVar65) goto LAB_00b2935a;
LAB_00b29327:
            peVar25 = local_4b8;
            oVar34.ptr = true_sel.ptr;
            peVar47 = peVar32;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          else {
            bVar64 = string_t::operator==
                               ((string_t *)(uVar14 + iVar29 * 0x10),
                                (string_t *)(uVar16 + iVar41 * 0x10));
            if (!bVar64) goto LAB_00b29327;
LAB_00b2935a:
            peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            peVar25 = peVar32;
            oVar34.ptr = false_sel.ptr;
          }
          (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)iVar21;
          iVar39 = iVar39 + 1;
          peVar32 = peVar47;
        } while (count != iVar39);
      }
      goto LAB_00b31195;
    }
    if (PVar1 == UINT128) {
      local_288 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
        UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
        UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          puVar45 = (uhugeint_t *)left->data;
          puVar53 = (uhugeint_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            lVar38 = 0;
            local_4b8 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = uhugeint_t::operator==(puVar45,puVar53);
                bVar64 = !bVar64;
              }
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
              puVar45 = puVar45 + 1;
              puVar53 = puVar53 + 1;
            } while (count != uVar56);
            return (idx_t)local_4b8;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(element_type *)0x0;
            }
            uVar56 = 0;
            local_4b8 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = uhugeint_t::operator==(puVar45,puVar53);
                bVar64 = !bVar64;
              }
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
              puVar45 = puVar45 + 1;
              puVar53 = puVar53 + 1;
            } while (count != uVar56);
            return (idx_t)local_4b8;
          }
          if (count != 0) {
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65 ^ 1);
              }
              else {
                bVar64 = uhugeint_t::operator==(puVar45,puVar53);
              }
              (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)bVar64;
              uVar56 = uVar56 + 1;
              puVar45 = puVar45 + 1;
              puVar53 = puVar53 + 1;
            } while (count != uVar56);
            goto LAB_00b32886;
          }
          goto LAB_00b32883;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar45 = (uhugeint_t *)right->data;
          puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          puVar53 = (uhugeint_t *)left->data;
          _local_498 = (undefined1  [16])0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
            local_308._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_428,(unsigned_long *)&local_308);
            peVar32 = LStack_490.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar15 = local_428;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_420._0_8_;
            _local_428 = (undefined1  [16])0x0;
            auVar13 = _local_428;
            local_428[0] = auVar15[0];
            local_428[1] = auVar15[1];
            local_428._2_6_ = auVar15._2_6_;
            LStack_490.id_ = local_428[0];
            LStack_490.physical_type_ = local_428[1];
            LStack_490._2_6_ = local_428._2_6_;
            _local_428 = auVar13;
            if (peVar32 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
              }
            }
            pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_498 + 8));
            local_498 = *(undefined1 (*) [8])
                         &(pTVar31->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>;
            *(undefined8 *)local_498 = 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(left);
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b3397e;
              lVar38 = 0;
              uVar56 = 0;
              do {
                uVar35 = uVar56;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar64 = false;
                }
                else {
                  bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar65 = false;
                }
                else {
                  bVar65 = (*(byte *)local_498 & 1) == 0;
                }
                if ((bVar64 | bVar65) == 1) {
                  bVar64 = (bool)(bVar64 ^ bVar65 ^ 1);
                }
                else {
                  bVar64 = uhugeint_t::operator==(puVar53,puVar45);
                }
                (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
                lVar38 = lVar38 + (ulong)bVar64;
                uVar56 = uVar56 + 1;
                puVar53 = puVar53 + 1;
              } while (count != uVar56);
              goto LAB_00b33981;
            }
            if (count != 0) {
              uVar56 = 0;
              local_4b8 = (element_type *)0x0;
              do {
                uVar35 = uVar56;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
                }
                puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar64 = false;
                }
                else {
                  bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar65 = false;
                }
                else {
                  bVar65 = (*(byte *)local_498 & 1) == 0;
                }
                if ((bVar64 | bVar65) == 1) {
                  bVar64 = (bool)(bVar64 ^ bVar65);
                }
                else {
                  bVar64 = uhugeint_t::operator==(puVar53,puVar45);
                  bVar64 = !bVar64;
                }
                (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
                local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
                uVar56 = uVar56 + 1;
                puVar53 = puVar53 + 1;
                local_478._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     LStack_490.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              } while (count != uVar56);
              goto LAB_00b33993;
            }
          }
          else if (count != 0) {
            lVar38 = 0;
            local_4b8 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = uhugeint_t::operator==(puVar53,puVar45);
                bVar64 = !bVar64;
              }
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
              puVar53 = puVar53 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar56);
            goto LAB_00b33993;
          }
          goto LAB_00b2fecd;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          puVar45 = (uhugeint_t *)left->data;
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          puVar53 = (uhugeint_t *)right->data;
          _local_498 = (undefined1  [16])0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
            local_308._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_428,(unsigned_long *)&local_308);
            peVar32 = LStack_490.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar15 = local_428;
            LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_420._0_8_;
            _local_428 = (undefined1  [16])0x0;
            auVar13 = _local_428;
            local_428[0] = auVar15[0];
            local_428[1] = auVar15[1];
            local_428._2_6_ = auVar15._2_6_;
            LStack_490.id_ = local_428[0];
            LStack_490.physical_type_ = local_428[1];
            LStack_490._2_6_ = local_428._2_6_;
            _local_428 = auVar13;
            if (peVar32 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
              }
            }
            pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_498 + 8));
            local_498 = *(undefined1 (*) [8])
                         &(pTVar31->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>;
            *(undefined8 *)local_498 = 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_00b3397e;
              lVar38 = 0;
              uVar56 = 0;
              do {
                uVar35 = uVar56;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar64 = false;
                }
                else {
                  bVar64 = (*(byte *)local_498 & 1) == 0;
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar65 = false;
                }
                else {
                  bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
                }
                if ((bVar64 | bVar65) == 1) {
                  bVar64 = (bool)(bVar64 ^ bVar65 ^ 1);
                }
                else {
                  bVar64 = uhugeint_t::operator==(puVar45,puVar53);
                }
                (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
                lVar38 = lVar38 + (ulong)bVar64;
                uVar56 = uVar56 + 1;
                puVar53 = puVar53 + 1;
              } while (count != uVar56);
              goto LAB_00b33981;
            }
            if (count != 0) {
              uVar56 = 0;
              local_4b8 = (element_type *)0x0;
              do {
                uVar35 = uVar56;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar64 = false;
                }
                else {
                  bVar64 = (*(byte *)local_498 & 1) == 0;
                }
                puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar65 = false;
                }
                else {
                  bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
                }
                if ((bVar64 | bVar65) == 1) {
                  bVar64 = (bool)(bVar64 ^ bVar65);
                }
                else {
                  bVar64 = uhugeint_t::operator==(puVar45,puVar53);
                  bVar64 = !bVar64;
                }
                (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
                local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
                uVar56 = uVar56 + 1;
                puVar53 = puVar53 + 1;
                local_478._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     LStack_490.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              } while (count != uVar56);
              goto LAB_00b33993;
            }
          }
          else if (count != 0) {
            lVar38 = 0;
            local_4b8 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = uhugeint_t::operator==(puVar45,puVar53);
                bVar64 = !bVar64;
              }
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
              puVar53 = puVar53 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar56);
            goto LAB_00b33993;
          }
          goto LAB_00b2fecd;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar2 == (unsigned_long *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*puVar2 & 1) == 0;
          }
          if (puVar3 == (unsigned_long *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = (*puVar3 & 1) == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            if (bVar64 != bVar65) {
LAB_00b31d63:
              if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
                psVar10 = (sel.ptr)->sel_vector;
                psVar11 = (true_sel.ptr)->sel_vector;
                iVar39 = 0;
                do {
                  sVar54 = (sel_t)iVar39;
                  if (psVar10 != (sel_t *)0x0) {
                    sVar54 = psVar10[iVar39];
                  }
                  psVar11[iVar39] = sVar54;
                  iVar39 = iVar39 + 1;
                } while (count != iVar39);
                return count;
              }
              return count;
            }
          }
          else {
            bVar64 = uhugeint_t::operator==((uhugeint_t *)left->data,(uhugeint_t *)right->data);
            if (!bVar64) goto LAB_00b31d63;
          }
          if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          iVar39 = 0;
          do {
            sVar54 = (sel_t)iVar39;
            if (psVar10 != (sel_t *)0x0) {
              sVar54 = psVar10[iVar39];
            }
            psVar11[iVar39] = sVar54;
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
          return (idx_t)(element_type *)0x0;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
      Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
      Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
      uVar14 = LStack_490._0_8_;
      uVar16 = LStack_420._0_8_;
      if (LStack_420.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0 &&
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count != 0) {
              psVar10 = (sel.ptr)->sel_vector;
              lVar38 = *(long *)local_498;
              psVar11 = *(sel_t **)local_428;
              lVar57 = 0;
              iVar39 = 0;
              do {
                iVar21 = iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  iVar21 = (idx_t)psVar10[iVar39];
                }
                iVar29 = iVar39;
                if (lVar38 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
                }
                iVar41 = iVar39;
                if (psVar11 != (sel_t *)0x0) {
                  iVar41 = (idx_t)psVar11[iVar39];
                }
                bVar64 = uhugeint_t::operator==
                                   ((uhugeint_t *)(uVar14 + iVar29 * 0x10),
                                    (uhugeint_t *)(uVar16 + iVar41 * 0x10));
                if (bVar64) {
                  (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
                  lVar57 = lVar57 + 1;
                }
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              goto LAB_00b31188;
            }
            goto LAB_00b31186;
          }
          if (count == 0) goto LAB_00b2ba44;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          iVar39 = 0;
          local_4b8 = (element_type *)0x0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            bVar64 = uhugeint_t::operator==
                               ((uhugeint_t *)(uVar14 + iVar29 * 0x10),
                                (uhugeint_t *)(uVar16 + iVar41 * 0x10));
            if (!bVar64) {
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
        }
        else {
          if (count == 0) goto LAB_00b2ba44;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          peVar32 = (element_type *)0x0;
          local_4b8 = (element_type *)0x0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            bVar64 = uhugeint_t::operator==
                               ((uhugeint_t *)(uVar14 + iVar29 * 0x10),
                                (uhugeint_t *)(uVar16 + iVar41 * 0x10));
            if (bVar64) {
              peVar25 = peVar32;
              oVar34.ptr = false_sel.ptr;
              peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            }
            else {
              peVar25 = local_4b8;
              oVar34.ptr = true_sel.ptr;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
            }
            (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)iVar21;
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
        }
      }
      else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b31186;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          lVar57 = 0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                       == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              if (bVar64 == bVar65) {
LAB_00b3114a:
                (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
                lVar57 = lVar57 + 1;
              }
            }
            else {
              bVar64 = uhugeint_t::operator==
                                 ((uhugeint_t *)(uVar14 + iVar29 * 0x10),
                                  (uhugeint_t *)(uVar16 + iVar41 * 0x10));
              if (bVar64) goto LAB_00b3114a;
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
          goto LAB_00b31188;
        }
        if (count == 0) goto LAB_00b2ba44;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        local_4b8 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            if (bVar64 != bVar65) {
LAB_00b2b9ff:
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
            }
          }
          else {
            bVar64 = uhugeint_t::operator==
                               ((uhugeint_t *)(uVar14 + iVar29 * 0x10),
                                (uhugeint_t *)(uVar16 + iVar41 * 0x10));
            if (!bVar64) goto LAB_00b2b9ff;
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
      }
      else {
        if (count == 0) goto LAB_00b2ba44;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        local_4b8 = (element_type *)0x0;
        iVar39 = 0;
        peVar32 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            if (bVar64 == bVar65) goto LAB_00b2945b;
LAB_00b29428:
            peVar25 = local_4b8;
            oVar34.ptr = true_sel.ptr;
            peVar47 = peVar32;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          else {
            bVar64 = uhugeint_t::operator==
                               ((uhugeint_t *)(uVar14 + iVar29 * 0x10),
                                (uhugeint_t *)(uVar16 + iVar41 * 0x10));
            if (!bVar64) goto LAB_00b29428;
LAB_00b2945b:
            peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            peVar25 = peVar32;
            oVar34.ptr = false_sel.ptr;
          }
          (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)iVar21;
          iVar39 = iVar39 + 1;
          peVar32 = peVar47;
        } while (count != iVar39);
      }
      goto LAB_00b31195;
    }
    if (PVar1 != INT128) goto switchD_00b24607_caseD_a;
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar38 = 8;
          lVar57 = 0;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(long *)(pdVar7 + lVar38) != *(long *)(pdVar9 + lVar38) ||
                       *(long *)(pdVar7 + lVar38 + -8) != *(long *)(pdVar9 + lVar38 + -8);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar57] = (sel_t)uVar35;
            lVar57 = lVar57 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            lVar38 = lVar38 + 0x10;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          lVar38 = 8;
          uVar56 = 0;
          peVar32 = (element_type *)0x0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(long *)(pdVar7 + lVar38) != *(long *)(pdVar9 + lVar38) ||
                       *(long *)(pdVar7 + lVar38 + -8) != *(long *)(pdVar9 + lVar38 + -8);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            uVar56 = uVar56 + 1;
            lVar38 = lVar38 + 0x10;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar57 = 8;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(long *)(pdVar7 + lVar57) != *(long *)(pdVar9 + lVar57) ||
                       *(long *)(pdVar7 + lVar57 + -8) != *(long *)(pdVar9 + lVar57 + -8);
            }
            psVar11[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            lVar57 = lVar57 + 0x10;
          } while (count != uVar56);
          goto LAB_00b32949;
        }
        goto LAB_00b32947;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        plVar48 = (long *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33a56;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            plVar49 = (long *)(pdVar7 + 8);
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *plVar49 != plVar48[1] || plVar49[-1] != *plVar48;
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
              plVar49 = plVar49 + 2;
            } while (count != uVar56);
            goto LAB_00b33a58;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            plVar49 = (long *)(pdVar7 + 8);
            uVar56 = 0;
            peVar32 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *plVar49 != plVar48[1] || plVar49[-1] != *plVar48;
              }
              psVar11[(long)peVar32] = (sel_t)uVar35;
              peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
              plVar49 = plVar49 + 2;
            } while (count != uVar56);
            goto LAB_00b33a63;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          plVar49 = (long *)(pdVar7 + 8);
          lVar38 = 0;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (*(byte *)local_498 & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *plVar49 != plVar48[1] || plVar49[-1] != *plVar48;
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            plVar49 = plVar49 + 2;
          } while (count != uVar56);
          goto LAB_00b33a63;
        }
        goto LAB_00b2ff83;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar48 = (long *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33b15;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            plVar49 = (long *)(pdVar7 + 8);
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = plVar48[1] != *plVar49 || *plVar48 != plVar49[-1];
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
              plVar49 = plVar49 + 2;
            } while (count != uVar56);
            goto LAB_00b33b17;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            plVar49 = (long *)(pdVar7 + 8);
            uVar56 = 0;
            local_4b8 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = plVar48[1] != *plVar49 || *plVar48 != plVar49[-1];
              }
              psVar11[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
              plVar49 = plVar49 + 2;
            } while (count != uVar56);
            goto LAB_00b30edc;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          plVar49 = (long *)(pdVar7 + 8);
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = plVar48[1] != *plVar49 || *plVar48 != plVar49[-1];
            }
            psVar11[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            plVar49 = plVar49 + 2;
          } while (count != uVar56);
          goto LAB_00b30edc;
        }
        goto LAB_00b3002f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = (*puVar3 & 1) == 0;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b31e3a:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar39 = 0;
              do {
                sVar54 = (sel_t)iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  sVar54 = psVar10[iVar39];
                }
                psVar11[iVar39] = sVar54;
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              return count;
            }
            return count;
          }
        }
        else if ((*(long *)left->data != *(long *)right->data) ||
                (*(long *)((long)left->data + 8) != *(long *)((long)right->data + 8)))
        goto LAB_00b31e3a;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          psVar11[iVar39] = sVar54;
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        return (idx_t)(element_type *)0x0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            lVar38 = 0;
          }
          else {
            psVar10 = (sel.ptr)->sel_vector;
            lVar57 = *(long *)local_498;
            psVar11 = *(sel_t **)local_428;
            lVar38 = 0;
            iVar39 = 0;
            do {
              iVar21 = iVar39;
              if (psVar10 != (sel_t *)0x0) {
                iVar21 = (idx_t)psVar10[iVar39];
              }
              iVar29 = iVar39;
              if (lVar57 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar57 + iVar39 * 4);
              }
              iVar41 = iVar39;
              if (psVar11 != (sel_t *)0x0) {
                iVar41 = (idx_t)psVar11[iVar39];
              }
              if ((*(long *)(LStack_490._0_8_ + iVar29 * 0x10) ==
                   *(long *)(LStack_420._0_8_ + iVar41 * 0x10)) &&
                 (*(long *)(LStack_490._0_8_ + (iVar29 * 2 + 1) * 8) ==
                  *(long *)(LStack_420._0_8_ + iVar41 * 0x10 + 8))) {
                (false_sel.ptr)->sel_vector[lVar38] = (sel_t)iVar21;
                lVar38 = lVar38 + 1;
              }
              iVar39 = iVar39 + 1;
            } while (count != iVar39);
          }
LAB_00b33b67:
          local_4b8 = (element_type *)(count - lVar38);
        }
        else {
          if (count == 0) goto LAB_00b2bbbb;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          iVar39 = 0;
          local_4b8 = (element_type *)0x0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if ((*(long *)(LStack_490._0_8_ + iVar29 * 0x10) !=
                 *(long *)(LStack_420._0_8_ + iVar41 * 0x10)) ||
               (*(long *)(LStack_490._0_8_ + (iVar29 * 2 + 1) * 8) !=
                *(long *)(LStack_420._0_8_ + iVar41 * 0x10 + 8))) {
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
        }
      }
      else if (count == 0) {
LAB_00b2bbbb:
        local_4b8 = (element_type *)0x0;
      }
      else {
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        peVar32 = (element_type *)0x0;
        peVar25 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if ((*(long *)(LStack_490._0_8_ + iVar29 * 0x10) ==
               *(long *)(LStack_420._0_8_ + iVar41 * 0x10)) &&
             (*(long *)(LStack_490._0_8_ + (iVar29 * 2 + 1) * 8) ==
              *(long *)(LStack_420._0_8_ + iVar41 * 0x10 + 8))) {
            oVar34.ptr = false_sel.ptr;
            peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            local_4b8 = peVar25;
          }
          else {
            local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
            oVar34.ptr = true_sel.ptr;
            peVar47 = peVar32;
            peVar32 = peVar25;
          }
          (oVar34.ptr)->sel_vector[(long)peVar32] = (sel_t)iVar21;
          iVar39 = iVar39 + 1;
          peVar32 = peVar47;
          peVar25 = local_4b8;
        } while (count != iVar39);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) {
          lVar38 = 0;
        }
        else {
          psVar10 = (sel.ptr)->sel_vector;
          lVar57 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          lVar38 = 0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar57 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar57 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                       == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              if (bVar64 == bVar65) {
LAB_00b3130b:
                (false_sel.ptr)->sel_vector[lVar38] = (sel_t)iVar21;
                lVar38 = lVar38 + 1;
              }
            }
            else if ((*(long *)(LStack_490._0_8_ + iVar29 * 0x10) ==
                      *(long *)(LStack_420._0_8_ + iVar41 * 0x10)) &&
                    (((long *)(LStack_490._0_8_ + iVar29 * 0x10))[1] ==
                     ((long *)(LStack_420._0_8_ + iVar41 * 0x10))[1])) goto LAB_00b3130b;
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
        }
        goto LAB_00b33b67;
      }
      if (count == 0) goto LAB_00b2bbbb;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      local_4b8 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b2bb9a:
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
        }
        else if ((*(long *)(LStack_490._0_8_ + iVar29 * 0x10) !=
                  *(long *)(LStack_420._0_8_ + iVar41 * 0x10)) ||
                (((long *)(LStack_490._0_8_ + iVar29 * 0x10))[1] !=
                 ((long *)(LStack_420._0_8_ + iVar41 * 0x10))[1])) goto LAB_00b2bb9a;
        iVar39 = iVar39 + 1;
      } while (count != iVar39);
    }
    else {
      if (count == 0) goto LAB_00b2bbbb;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      peVar32 = (element_type *)0x0;
      peVar25 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 == bVar65) goto LAB_00b29555;
LAB_00b29563:
          peVar47 = peVar32;
          local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
          peVar32 = peVar25;
          oVar34.ptr = true_sel.ptr;
        }
        else {
          if ((*(long *)(LStack_490._0_8_ + iVar29 * 0x10) !=
               *(long *)(LStack_420._0_8_ + iVar41 * 0x10)) ||
             (((long *)(LStack_490._0_8_ + iVar29 * 0x10))[1] !=
              ((long *)(LStack_420._0_8_ + iVar41 * 0x10))[1])) goto LAB_00b29563;
LAB_00b29555:
          peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          local_4b8 = peVar25;
          oVar34.ptr = false_sel.ptr;
        }
        (oVar34.ptr)->sel_vector[(long)peVar32] = (sel_t)iVar21;
        iVar39 = iVar39 + 1;
        peVar32 = peVar47;
        peVar25 = local_4b8;
      } while (count != iVar39);
    }
    if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
    }
    goto joined_r0x00b33b8a;
  }
  switch(PVar1) {
  case BOOL:
  case INT8:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = pdVar7[uVar56] != pdVar9[uVar56];
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = pdVar7[uVar56] != pdVar9[uVar56];
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = pdVar7[uVar56] != pdVar9[uVar56];
            }
            psVar11[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b32949;
        }
LAB_00b32947:
        lVar38 = 0;
LAB_00b32949:
        return (idx_t)(element_type *)(count - lVar38);
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar7 = right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_00b33a56:
              lVar38 = 0;
            }
            else {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (false_sel.ptr)->sel_vector;
              lVar38 = 0;
              uVar56 = 0;
              do {
                uVar35 = uVar56;
                if (psVar10 != (sel_t *)0x0) {
                  uVar35 = (ulong)psVar10[uVar56];
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar64 = false;
                }
                else {
                  bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar65 = false;
                }
                else {
                  bVar65 = (*(byte *)local_498 & 1) == 0;
                }
                if ((bVar64 | bVar65) == 1) {
                  bVar64 = (bool)(bVar64 ^ bVar65);
                }
                else {
                  bVar64 = pdVar9[uVar56] != *pdVar7;
                }
                psVar11[lVar38] = (sel_t)uVar35;
                lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
                uVar56 = uVar56 + 1;
              } while (count != uVar56);
            }
LAB_00b33a58:
            peVar32 = (element_type *)(count - lVar38);
            goto LAB_00b33a63;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            peVar32 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = pdVar9[uVar56] != *pdVar7;
              }
              psVar11[(long)peVar32] = (sel_t)uVar35;
              peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a63;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (*(byte *)local_498 & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = pdVar9[uVar56] != *pdVar7;
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b33a63;
        }
LAB_00b2ff83:
        peVar32 = (element_type *)0x0;
LAB_00b33a63:
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     LStack_490.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          return (idx_t)peVar32;
        }
        return (idx_t)peVar32;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar5 = left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_00b33b15:
              lVar38 = 0;
            }
            else {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (false_sel.ptr)->sel_vector;
              lVar38 = 0;
              uVar56 = 0;
              do {
                uVar35 = uVar56;
                if (psVar10 != (sel_t *)0x0) {
                  uVar35 = (ulong)psVar10[uVar56];
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar64 = false;
                }
                else {
                  bVar64 = (*(byte *)local_498 & 1) == 0;
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar65 = false;
                }
                else {
                  bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
                }
                if ((bVar64 | bVar65) == 1) {
                  bVar64 = (bool)(bVar64 ^ bVar65);
                }
                else {
                  bVar64 = *pdVar5 != pdVar7[uVar56];
                }
                psVar11[lVar38] = (sel_t)uVar35;
                lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
                uVar56 = uVar56 + 1;
              } while (count != uVar56);
            }
LAB_00b33b17:
            local_4b8 = (element_type *)(count - lVar38);
            local_118.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_00b30edc;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4b8 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *pdVar5 != pdVar7[uVar56];
              }
              psVar11[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b30edc;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4b8 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *pdVar5 != pdVar7[uVar56];
            }
            psVar11[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b30edc;
        }
LAB_00b3002f:
        local_4b8 = (element_type *)0x0;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        goto LAB_00b30edc;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = (*puVar3 & 1) == 0;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b2e2c5:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar39 = 0;
              do {
                sVar54 = (sel_t)iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  sVar54 = psVar10[iVar39];
                }
                psVar11[iVar39] = sVar54;
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              return count;
            }
            return count;
          }
        }
        else if (*left->data != *right->data) goto LAB_00b2e2c5;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          psVar11[iVar39] = sVar54;
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        return (idx_t)(element_type *)0x0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b30dcd;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          lVar57 = 0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if (*(data_ptr_t)(LStack_490._0_8_ + iVar29) == *(data_t *)(LStack_420._0_8_ + iVar41))
            {
              (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
              lVar57 = lVar57 + 1;
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
LAB_00b30dcf:
          local_4b8 = (element_type *)(count - lVar57);
        }
        else {
          if (count == 0) goto LAB_00b2b73c;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          local_4b8 = (element_type *)0x0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if (*(data_ptr_t)(LStack_490._0_8_ + iVar29) != *(data_t *)(LStack_420._0_8_ + iVar41))
            {
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
        }
      }
      else if (count == 0) {
LAB_00b2b73c:
        local_4b8 = (element_type *)0x0;
      }
      else {
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        peVar32 = (element_type *)0x0;
        peVar25 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(data_ptr_t)(LStack_490._0_8_ + iVar29) == *(data_t *)(LStack_420._0_8_ + iVar41)) {
            oVar34.ptr = false_sel.ptr;
            peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            local_4b8 = peVar25;
          }
          else {
            local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
            oVar34.ptr = true_sel.ptr;
            peVar47 = peVar32;
            peVar32 = peVar25;
          }
          (oVar34.ptr)->sel_vector[(long)peVar32] = (sel_t)iVar21;
          iVar39 = iVar39 + 1;
          peVar32 = peVar47;
          peVar25 = local_4b8;
        } while (count != iVar39);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b30e97;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        lVar57 = 0;
        iVar39 = 0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            bVar64 = bVar64 == bVar65;
          }
          else {
            bVar64 = *(data_ptr_t)(LStack_490._0_8_ + iVar29) ==
                     *(data_t *)(LStack_420._0_8_ + iVar41);
          }
          if (bVar64) {
            (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
            lVar57 = lVar57 + 1;
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
LAB_00b30e99:
        local_4b8 = (element_type *)(count - lVar57);
      }
      else {
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        local_4b8 = (element_type *)0x0;
        iVar39 = 0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            bVar64 = bVar64 == bVar65;
          }
          else {
            bVar64 = *(data_ptr_t)(LStack_490._0_8_ + iVar29) ==
                     *(data_t *)(LStack_420._0_8_ + iVar41);
          }
          if (!bVar64) {
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
      }
    }
    else {
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      peVar32 = (element_type *)0x0;
      peVar25 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(data_ptr_t)(LStack_490._0_8_ + iVar29) ==
                   *(data_t *)(LStack_420._0_8_ + iVar41);
        }
        if (bVar64) {
          local_4b8 = peVar25;
          peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          peVar25 = peVar32;
          oVar34.ptr = false_sel.ptr;
        }
        else {
          local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
          peVar47 = peVar32;
          oVar34.ptr = true_sel.ptr;
        }
        (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)iVar21;
        iVar39 = iVar39 + 1;
        peVar32 = peVar47;
        peVar25 = local_4b8;
      } while (count != iVar39);
    }
    break;
  case UINT8:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = pdVar7[uVar56] != pdVar9[uVar56];
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = pdVar7[uVar56] != pdVar9[uVar56];
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = pdVar7[uVar56] != pdVar9[uVar56];
            }
            psVar11[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b32949;
        }
        goto LAB_00b32947;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar7 = right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar9 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33a56;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = pdVar9[uVar56] != *pdVar7;
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a58;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            peVar32 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = pdVar9[uVar56] != *pdVar7;
              }
              psVar11[(long)peVar32] = (sel_t)uVar35;
              peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a63;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (*(byte *)local_498 & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = pdVar9[uVar56] != *pdVar7;
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b33a63;
        }
        goto LAB_00b2ff83;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar5 = left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33b15;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *pdVar5 != pdVar7[uVar56];
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33b17;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4b8 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *pdVar5 != pdVar7[uVar56];
              }
              psVar11[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b30edc;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4b8 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *pdVar5 != pdVar7[uVar56];
            }
            psVar11[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b30edc;
        }
        goto LAB_00b3002f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = (*puVar3 & 1) == 0;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b31a7a:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar39 = 0;
              do {
                sVar54 = (sel_t)iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  sVar54 = psVar10[iVar39];
                }
                psVar11[iVar39] = sVar54;
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              return count;
            }
            return count;
          }
        }
        else if (*left->data != *right->data) goto LAB_00b31a7a;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          psVar11[iVar39] = sVar54;
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        return (idx_t)(element_type *)0x0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        peVar32 = (element_type *)0x0;
        peVar25 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(data_ptr_t)(LStack_490._0_8_ + iVar29) == *(data_t *)(LStack_420._0_8_ + iVar41)) {
            oVar34.ptr = false_sel.ptr;
            peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            local_4b8 = peVar25;
          }
          else {
            local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
            oVar34.ptr = true_sel.ptr;
            peVar47 = peVar32;
            peVar32 = peVar25;
          }
          (oVar34.ptr)->sel_vector[(long)peVar32] = (sel_t)iVar21;
          iVar39 = iVar39 + 1;
          peVar32 = peVar47;
          peVar25 = local_4b8;
        } while (count != iVar39);
      }
      else {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b30dcd;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          lVar57 = 0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if (*(data_ptr_t)(LStack_490._0_8_ + iVar29) == *(data_t *)(LStack_420._0_8_ + iVar41))
            {
              (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
              lVar57 = lVar57 + 1;
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
          goto LAB_00b30dcf;
        }
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        local_4b8 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(data_ptr_t)(LStack_490._0_8_ + iVar29) != *(data_t *)(LStack_420._0_8_ + iVar41)) {
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
      }
    }
    else if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      peVar32 = (element_type *)0x0;
      peVar25 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(data_ptr_t)(LStack_490._0_8_ + iVar29) ==
                   *(data_t *)(LStack_420._0_8_ + iVar41);
        }
        if (bVar64) {
          local_4b8 = peVar25;
          peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          peVar25 = peVar32;
          oVar34.ptr = false_sel.ptr;
        }
        else {
          local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
          peVar47 = peVar32;
          oVar34.ptr = true_sel.ptr;
        }
        (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)iVar21;
        iVar39 = iVar39 + 1;
        peVar32 = peVar47;
        peVar25 = local_4b8;
      } while (count != iVar39);
    }
    else {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b30e97;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        lVar57 = 0;
        iVar39 = 0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            bVar64 = bVar64 == bVar65;
          }
          else {
            bVar64 = *(data_ptr_t)(LStack_490._0_8_ + iVar29) ==
                     *(data_t *)(LStack_420._0_8_ + iVar41);
          }
          if (bVar64) {
            (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
            lVar57 = lVar57 + 1;
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        goto LAB_00b30e99;
      }
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      local_4b8 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(data_ptr_t)(LStack_490._0_8_ + iVar29) ==
                   *(data_t *)(LStack_420._0_8_ + iVar41);
        }
        if (!bVar64) {
          (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
          local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
        }
        iVar39 = iVar39 + 1;
      } while (count != iVar39);
    }
    break;
  case UINT16:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(short *)(pdVar7 + uVar56 * 2) != *(short *)(pdVar9 + uVar56 * 2);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          uVar56 = 0;
          peVar32 = (element_type *)0x0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(short *)(pdVar7 + uVar56 * 2) != *(short *)(pdVar9 + uVar56 * 2);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(short *)(pdVar7 + uVar56 * 2) != *(short *)(pdVar9 + uVar56 * 2);
            }
            psVar11[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b32949;
        }
        goto LAB_00b32947;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        psVar6 = (short *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33a56;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *(short *)(pdVar7 + uVar56 * 2) != *psVar6;
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a58;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            uVar56 = 0;
            peVar32 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *(short *)(pdVar7 + uVar56 * 2) != *psVar6;
              }
              psVar11[(long)peVar32] = (sel_t)uVar35;
              peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a63;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (*(byte *)local_498 & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(short *)(pdVar7 + uVar56 * 2) != *psVar6;
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b33a63;
        }
        goto LAB_00b2ff83;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar6 = (short *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33b15;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *psVar6 != *(short *)(pdVar7 + uVar56 * 2);
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33b17;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            uVar56 = 0;
            local_4b8 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *psVar6 != *(short *)(pdVar7 + uVar56 * 2);
              }
              psVar11[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b30edc;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *psVar6 != *(short *)(pdVar7 + uVar56 * 2);
            }
            psVar11[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b30edc;
        }
        goto LAB_00b3002f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = (*puVar3 & 1) == 0;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b31904:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar39 = 0;
              do {
                sVar54 = (sel_t)iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  sVar54 = psVar10[iVar39];
                }
                psVar11[iVar39] = sVar54;
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              return count;
            }
            return count;
          }
        }
        else if (*(short *)left->data != *(short *)right->data) goto LAB_00b31904;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          psVar11[iVar39] = sVar54;
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        return (idx_t)(element_type *)0x0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b30dcd;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          lVar57 = 0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if (*(short *)(LStack_490._0_8_ + iVar29 * 2) ==
                *(short *)(LStack_420._0_8_ + iVar41 * 2)) {
              (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
              lVar57 = lVar57 + 1;
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
          goto LAB_00b30dcf;
        }
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        local_4b8 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(short *)(LStack_490._0_8_ + iVar29 * 2) != *(short *)(LStack_420._0_8_ + iVar41 * 2)
             ) {
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
      }
      else {
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        peVar32 = (element_type *)0x0;
        peVar25 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(short *)(LStack_490._0_8_ + iVar29 * 2) == *(short *)(LStack_420._0_8_ + iVar41 * 2)
             ) {
            oVar34.ptr = false_sel.ptr;
            peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            local_4b8 = peVar25;
          }
          else {
            local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
            oVar34.ptr = true_sel.ptr;
            peVar47 = peVar32;
            peVar32 = peVar25;
          }
          (oVar34.ptr)->sel_vector[(long)peVar32] = (sel_t)iVar21;
          iVar39 = iVar39 + 1;
          peVar32 = peVar47;
          peVar25 = local_4b8;
        } while (count != iVar39);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b30e97;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        lVar57 = 0;
        iVar39 = 0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            bVar64 = bVar64 == bVar65;
          }
          else {
            bVar64 = *(short *)(LStack_490._0_8_ + iVar29 * 2) ==
                     *(short *)(LStack_420._0_8_ + iVar41 * 2);
          }
          if (bVar64) {
            (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
            lVar57 = lVar57 + 1;
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        goto LAB_00b30e99;
      }
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      local_4b8 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(short *)(LStack_490._0_8_ + iVar29 * 2) ==
                   *(short *)(LStack_420._0_8_ + iVar41 * 2);
        }
        if (!bVar64) {
          (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
          local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
        }
        iVar39 = iVar39 + 1;
      } while (count != iVar39);
    }
    else {
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      peVar32 = (element_type *)0x0;
      peVar25 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(short *)(LStack_490._0_8_ + iVar29 * 2) ==
                   *(short *)(LStack_420._0_8_ + iVar41 * 2);
        }
        if (bVar64) {
          local_4b8 = peVar25;
          peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          peVar25 = peVar32;
          oVar34.ptr = false_sel.ptr;
        }
        else {
          local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
          peVar47 = peVar32;
          oVar34.ptr = true_sel.ptr;
        }
        (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)iVar21;
        iVar39 = iVar39 + 1;
        peVar32 = peVar47;
        peVar25 = local_4b8;
      } while (count != iVar39);
    }
    break;
  case INT16:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(short *)(pdVar7 + uVar56 * 2) != *(short *)(pdVar9 + uVar56 * 2);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(short *)(pdVar7 + uVar56 * 2) != *(short *)(pdVar9 + uVar56 * 2);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(short *)(pdVar7 + uVar56 * 2) != *(short *)(pdVar9 + uVar56 * 2);
            }
            psVar11[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b32949;
        }
        goto LAB_00b32947;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        psVar6 = (short *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33a56;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *(short *)(pdVar7 + uVar56 * 2) != *psVar6;
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a58;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            peVar32 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *(short *)(pdVar7 + uVar56 * 2) != *psVar6;
              }
              psVar11[(long)peVar32] = (sel_t)uVar35;
              peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a63;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (*(byte *)local_498 & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(short *)(pdVar7 + uVar56 * 2) != *psVar6;
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b33a63;
        }
        goto LAB_00b2ff83;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar6 = (short *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33b15;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *psVar6 != *(short *)(pdVar7 + uVar56 * 2);
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33b17;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4b8 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *psVar6 != *(short *)(pdVar7 + uVar56 * 2);
              }
              psVar11[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b30edc;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4b8 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *psVar6 != *(short *)(pdVar7 + uVar56 * 2);
            }
            psVar11[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b30edc;
        }
        goto LAB_00b3002f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = (*puVar3 & 1) == 0;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b31848:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar39 = 0;
              do {
                sVar54 = (sel_t)iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  sVar54 = psVar10[iVar39];
                }
                psVar11[iVar39] = sVar54;
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              return count;
            }
            return count;
          }
        }
        else if (*(short *)left->data != *(short *)right->data) goto LAB_00b31848;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          psVar11[iVar39] = sVar54;
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        return (idx_t)(element_type *)0x0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b30dcd;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          lVar57 = 0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if (*(short *)(LStack_490._0_8_ + iVar29 * 2) ==
                *(short *)(LStack_420._0_8_ + iVar41 * 2)) {
              (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
              lVar57 = lVar57 + 1;
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
          goto LAB_00b30dcf;
        }
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        local_4b8 = (element_type *)0x0;
        iVar39 = 0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(short *)(LStack_490._0_8_ + iVar29 * 2) != *(short *)(LStack_420._0_8_ + iVar41 * 2)
             ) {
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
      }
      else {
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        peVar32 = (element_type *)0x0;
        peVar25 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(short *)(LStack_490._0_8_ + iVar29 * 2) == *(short *)(LStack_420._0_8_ + iVar41 * 2)
             ) {
            oVar34.ptr = false_sel.ptr;
            peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            local_4b8 = peVar25;
          }
          else {
            local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
            oVar34.ptr = true_sel.ptr;
            peVar47 = peVar32;
            peVar32 = peVar25;
          }
          (oVar34.ptr)->sel_vector[(long)peVar32] = (sel_t)iVar21;
          iVar39 = iVar39 + 1;
          peVar32 = peVar47;
          peVar25 = local_4b8;
        } while (count != iVar39);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b30e97;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        lVar57 = 0;
        iVar39 = 0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            bVar64 = bVar64 == bVar65;
          }
          else {
            bVar64 = *(short *)(LStack_490._0_8_ + iVar29 * 2) ==
                     *(short *)(LStack_420._0_8_ + iVar41 * 2);
          }
          if (bVar64) {
            (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
            lVar57 = lVar57 + 1;
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        goto LAB_00b30e99;
      }
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      local_4b8 = (element_type *)0x0;
      iVar39 = 0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(short *)(LStack_490._0_8_ + iVar29 * 2) ==
                   *(short *)(LStack_420._0_8_ + iVar41 * 2);
        }
        if (!bVar64) {
          (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
          local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
        }
        iVar39 = iVar39 + 1;
      } while (count != iVar39);
    }
    else {
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      peVar32 = (element_type *)0x0;
      peVar25 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(short *)(LStack_490._0_8_ + iVar29 * 2) ==
                   *(short *)(LStack_420._0_8_ + iVar41 * 2);
        }
        if (bVar64) {
          local_4b8 = peVar25;
          peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          peVar25 = peVar32;
          oVar34.ptr = false_sel.ptr;
        }
        else {
          local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
          peVar47 = peVar32;
          oVar34.ptr = true_sel.ptr;
        }
        (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)iVar21;
        iVar39 = iVar39 + 1;
        peVar32 = peVar47;
        peVar25 = local_4b8;
      } while (count != iVar39);
    }
    break;
  case UINT32:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(int *)(pdVar7 + uVar56 * 4) != *(int *)(pdVar9 + uVar56 * 4);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          uVar56 = 0;
          peVar32 = (element_type *)0x0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(int *)(pdVar7 + uVar56 * 4) != *(int *)(pdVar9 + uVar56 * 4);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(int *)(pdVar7 + uVar56 * 4) != *(int *)(pdVar9 + uVar56 * 4);
            }
            psVar11[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b32949;
        }
        goto LAB_00b32947;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar24 = (int *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33a56;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *(int *)(pdVar7 + uVar56 * 4) != *piVar24;
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a58;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            uVar56 = 0;
            peVar32 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *(int *)(pdVar7 + uVar56 * 4) != *piVar24;
              }
              psVar11[(long)peVar32] = (sel_t)uVar35;
              peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a63;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (*(byte *)local_498 & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(int *)(pdVar7 + uVar56 * 4) != *piVar24;
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b33a63;
        }
        goto LAB_00b2ff83;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar24 = (int *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33b15;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *piVar24 != *(int *)(pdVar7 + uVar56 * 4);
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33b17;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            uVar56 = 0;
            local_4b8 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *piVar24 != *(int *)(pdVar7 + uVar56 * 4);
              }
              psVar11[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b30edc;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *piVar24 != *(int *)(pdVar7 + uVar56 * 4);
            }
            psVar11[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b30edc;
        }
        goto LAB_00b3002f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = (*puVar3 & 1) == 0;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b3178c:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar39 = 0;
              do {
                sVar54 = (sel_t)iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  sVar54 = psVar10[iVar39];
                }
                psVar11[iVar39] = sVar54;
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              return count;
            }
            return count;
          }
        }
        else if (*(int *)left->data != *(int *)right->data) goto LAB_00b3178c;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          psVar11[iVar39] = sVar54;
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        return (idx_t)(element_type *)0x0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b30dcd;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          lVar57 = 0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if (*(int *)(LStack_490._0_8_ + iVar29 * 4) == *(int *)(LStack_420._0_8_ + iVar41 * 4))
            {
              (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
              lVar57 = lVar57 + 1;
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
          goto LAB_00b30dcf;
        }
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        local_4b8 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(int *)(LStack_490._0_8_ + iVar29 * 4) != *(int *)(LStack_420._0_8_ + iVar41 * 4)) {
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
      }
      else {
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        peVar32 = (element_type *)0x0;
        peVar25 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(int *)(LStack_490._0_8_ + iVar29 * 4) == *(int *)(LStack_420._0_8_ + iVar41 * 4)) {
            oVar34.ptr = false_sel.ptr;
            peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            local_4b8 = peVar25;
          }
          else {
            local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
            oVar34.ptr = true_sel.ptr;
            peVar47 = peVar32;
            peVar32 = peVar25;
          }
          (oVar34.ptr)->sel_vector[(long)peVar32] = (sel_t)iVar21;
          iVar39 = iVar39 + 1;
          peVar32 = peVar47;
          peVar25 = local_4b8;
        } while (count != iVar39);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b30e97;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        lVar57 = 0;
        iVar39 = 0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            bVar64 = bVar64 == bVar65;
          }
          else {
            bVar64 = *(int *)(LStack_490._0_8_ + iVar29 * 4) ==
                     *(int *)(LStack_420._0_8_ + iVar41 * 4);
          }
          if (bVar64) {
            (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
            lVar57 = lVar57 + 1;
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        goto LAB_00b30e99;
      }
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      local_4b8 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(int *)(LStack_490._0_8_ + iVar29 * 4) ==
                   *(int *)(LStack_420._0_8_ + iVar41 * 4);
        }
        if (!bVar64) {
          (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
          local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
        }
        iVar39 = iVar39 + 1;
      } while (count != iVar39);
    }
    else {
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      peVar32 = (element_type *)0x0;
      peVar25 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(int *)(LStack_490._0_8_ + iVar29 * 4) ==
                   *(int *)(LStack_420._0_8_ + iVar41 * 4);
        }
        if (bVar64) {
          local_4b8 = peVar25;
          peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          peVar25 = peVar32;
          oVar34.ptr = false_sel.ptr;
        }
        else {
          local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
          peVar47 = peVar32;
          oVar34.ptr = true_sel.ptr;
        }
        (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)iVar21;
        iVar39 = iVar39 + 1;
        peVar32 = peVar47;
        peVar25 = local_4b8;
      } while (count != iVar39);
    }
    break;
  case INT32:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(int *)(pdVar7 + uVar56 * 4) != *(int *)(pdVar9 + uVar56 * 4);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(int *)(pdVar7 + uVar56 * 4) != *(int *)(pdVar9 + uVar56 * 4);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(int *)(pdVar7 + uVar56 * 4) != *(int *)(pdVar9 + uVar56 * 4);
            }
            psVar11[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b32949;
        }
        goto LAB_00b32947;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar24 = (int *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33a56;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *(int *)(pdVar7 + uVar56 * 4) != *piVar24;
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a58;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            peVar32 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *(int *)(pdVar7 + uVar56 * 4) != *piVar24;
              }
              psVar11[(long)peVar32] = (sel_t)uVar35;
              peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a63;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (*(byte *)local_498 & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(int *)(pdVar7 + uVar56 * 4) != *piVar24;
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b33a63;
        }
        goto LAB_00b2ff83;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar24 = (int *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33b15;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *piVar24 != *(int *)(pdVar7 + uVar56 * 4);
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33b17;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4b8 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *piVar24 != *(int *)(pdVar7 + uVar56 * 4);
              }
              psVar11[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b30edc;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4b8 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *piVar24 != *(int *)(pdVar7 + uVar56 * 4);
            }
            psVar11[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b30edc;
        }
        goto LAB_00b3002f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = (*puVar3 & 1) == 0;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b316d2:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar39 = 0;
              do {
                sVar54 = (sel_t)iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  sVar54 = psVar10[iVar39];
                }
                psVar11[iVar39] = sVar54;
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              return count;
            }
            return count;
          }
        }
        else if (*(int *)left->data != *(int *)right->data) goto LAB_00b316d2;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          psVar11[iVar39] = sVar54;
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        return (idx_t)(element_type *)0x0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b30dcd;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          lVar57 = 0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if (*(int *)(LStack_490._0_8_ + iVar29 * 4) == *(int *)(LStack_420._0_8_ + iVar41 * 4))
            {
              (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
              lVar57 = lVar57 + 1;
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
          goto LAB_00b30dcf;
        }
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        local_4b8 = (element_type *)0x0;
        iVar39 = 0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(int *)(LStack_490._0_8_ + iVar29 * 4) != *(int *)(LStack_420._0_8_ + iVar41 * 4)) {
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
      }
      else {
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        peVar32 = (element_type *)0x0;
        peVar25 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(int *)(LStack_490._0_8_ + iVar29 * 4) == *(int *)(LStack_420._0_8_ + iVar41 * 4)) {
            oVar34.ptr = false_sel.ptr;
            peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            local_4b8 = peVar25;
          }
          else {
            local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
            oVar34.ptr = true_sel.ptr;
            peVar47 = peVar32;
            peVar32 = peVar25;
          }
          (oVar34.ptr)->sel_vector[(long)peVar32] = (sel_t)iVar21;
          iVar39 = iVar39 + 1;
          peVar32 = peVar47;
          peVar25 = local_4b8;
        } while (count != iVar39);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b30e97;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        lVar57 = 0;
        iVar39 = 0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            bVar64 = bVar64 == bVar65;
          }
          else {
            bVar64 = *(int *)(LStack_490._0_8_ + iVar29 * 4) ==
                     *(int *)(LStack_420._0_8_ + iVar41 * 4);
          }
          if (bVar64) {
            (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
            lVar57 = lVar57 + 1;
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        goto LAB_00b30e99;
      }
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      local_4b8 = (element_type *)0x0;
      iVar39 = 0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(int *)(LStack_490._0_8_ + iVar29 * 4) ==
                   *(int *)(LStack_420._0_8_ + iVar41 * 4);
        }
        if (!bVar64) {
          (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
          local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
        }
        iVar39 = iVar39 + 1;
      } while (count != iVar39);
    }
    else {
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      peVar32 = (element_type *)0x0;
      peVar25 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(int *)(LStack_490._0_8_ + iVar29 * 4) ==
                   *(int *)(LStack_420._0_8_ + iVar41 * 4);
        }
        if (bVar64) {
          local_4b8 = peVar25;
          peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          peVar25 = peVar32;
          oVar34.ptr = false_sel.ptr;
        }
        else {
          local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
          peVar47 = peVar32;
          oVar34.ptr = true_sel.ptr;
        }
        (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)iVar21;
        iVar39 = iVar39 + 1;
        peVar32 = peVar47;
        peVar25 = local_4b8;
      } while (count != iVar39);
    }
    break;
  case UINT64:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(long *)(pdVar7 + uVar56 * 8) != *(long *)(pdVar9 + uVar56 * 8);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          uVar56 = 0;
          peVar32 = (element_type *)0x0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(long *)(pdVar7 + uVar56 * 8) != *(long *)(pdVar9 + uVar56 * 8);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(long *)(pdVar7 + uVar56 * 8) != *(long *)(pdVar9 + uVar56 * 8);
            }
            psVar11[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b32949;
        }
        goto LAB_00b32947;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        plVar48 = (long *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33a56;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *(long *)(pdVar7 + uVar56 * 8) != *plVar48;
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a58;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            uVar56 = 0;
            peVar32 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *(long *)(pdVar7 + uVar56 * 8) != *plVar48;
              }
              psVar11[(long)peVar32] = (sel_t)uVar35;
              peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a63;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (*(byte *)local_498 & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(long *)(pdVar7 + uVar56 * 8) != *plVar48;
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b33a63;
        }
        goto LAB_00b2ff83;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar48 = (long *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33b15;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *plVar48 != *(long *)(pdVar7 + uVar56 * 8);
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33b17;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            uVar56 = 0;
            local_4b8 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *plVar48 != *(long *)(pdVar7 + uVar56 * 8);
              }
              psVar11[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b30edc;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *plVar48 != *(long *)(pdVar7 + uVar56 * 8);
            }
            psVar11[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b30edc;
        }
        goto LAB_00b3002f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = (*puVar3 & 1) == 0;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b31bd3:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar39 = 0;
              do {
                sVar54 = (sel_t)iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  sVar54 = psVar10[iVar39];
                }
                psVar11[iVar39] = sVar54;
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              return count;
            }
            return count;
          }
        }
        else if (*(long *)left->data != *(long *)right->data) goto LAB_00b31bd3;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          psVar11[iVar39] = sVar54;
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        return (idx_t)(element_type *)0x0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        peVar32 = (element_type *)0x0;
        peVar25 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(long *)(LStack_490._0_8_ + iVar29 * 8) == *(long *)(LStack_420._0_8_ + iVar41 * 8))
          {
            oVar34.ptr = false_sel.ptr;
            peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            local_4b8 = peVar25;
          }
          else {
            local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
            oVar34.ptr = true_sel.ptr;
            peVar47 = peVar32;
            peVar32 = peVar25;
          }
          (oVar34.ptr)->sel_vector[(long)peVar32] = (sel_t)iVar21;
          iVar39 = iVar39 + 1;
          peVar32 = peVar47;
          peVar25 = local_4b8;
        } while (count != iVar39);
      }
      else {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            lVar38 = *(long *)local_498;
            psVar11 = *(sel_t **)local_428;
            lVar57 = 0;
            iVar39 = 0;
            do {
              iVar21 = iVar39;
              if (psVar10 != (sel_t *)0x0) {
                iVar21 = (idx_t)psVar10[iVar39];
              }
              iVar29 = iVar39;
              if (lVar38 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
              }
              iVar41 = iVar39;
              if (psVar11 != (sel_t *)0x0) {
                iVar41 = (idx_t)psVar11[iVar39];
              }
              if (*(long *)(LStack_490._0_8_ + iVar29 * 8) ==
                  *(long *)(LStack_420._0_8_ + iVar41 * 8)) {
                (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
                lVar57 = lVar57 + 1;
              }
              iVar39 = iVar39 + 1;
            } while (count != iVar39);
            goto LAB_00b30dcf;
          }
LAB_00b30dcd:
          lVar57 = 0;
          goto LAB_00b30dcf;
        }
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        local_4b8 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(long *)(LStack_490._0_8_ + iVar29 * 8) != *(long *)(LStack_420._0_8_ + iVar41 * 8))
          {
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
      }
    }
    else if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      peVar32 = (element_type *)0x0;
      peVar25 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(long *)(LStack_490._0_8_ + iVar29 * 8) ==
                   *(long *)(LStack_420._0_8_ + iVar41 * 8);
        }
        if (bVar64) {
          local_4b8 = peVar25;
          peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          peVar25 = peVar32;
          oVar34.ptr = false_sel.ptr;
        }
        else {
          local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
          peVar47 = peVar32;
          oVar34.ptr = true_sel.ptr;
        }
        (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)iVar21;
        iVar39 = iVar39 + 1;
        peVar32 = peVar47;
        peVar25 = local_4b8;
      } while (count != iVar39);
    }
    else {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          lVar57 = 0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                       == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = bVar64 == bVar65;
            }
            else {
              bVar64 = *(long *)(LStack_490._0_8_ + iVar29 * 8) ==
                       *(long *)(LStack_420._0_8_ + iVar41 * 8);
            }
            if (bVar64) {
              (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
              lVar57 = lVar57 + 1;
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
          goto LAB_00b30e99;
        }
LAB_00b30e97:
        lVar57 = 0;
        goto LAB_00b30e99;
      }
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      local_4b8 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(long *)(LStack_490._0_8_ + iVar29 * 8) ==
                   *(long *)(LStack_420._0_8_ + iVar41 * 8);
        }
        if (!bVar64) {
          (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
          local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
        }
        iVar39 = iVar39 + 1;
      } while (count != iVar39);
    }
    break;
  case INT64:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(long *)(pdVar7 + uVar56 * 8) != *(long *)(pdVar9 + uVar56 * 8);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(long *)(pdVar7 + uVar56 * 8) != *(long *)(pdVar9 + uVar56 * 8);
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          return (idx_t)peVar32;
        }
        if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(long *)(pdVar7 + uVar56 * 8) != *(long *)(pdVar9 + uVar56 * 8);
            }
            psVar11[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b32949;
        }
        goto LAB_00b32947;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        plVar48 = (long *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33a56;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *(long *)(pdVar7 + uVar56 * 8) != *plVar48;
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a58;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            peVar32 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *(long *)(pdVar7 + uVar56 * 8) != *plVar48;
              }
              psVar11[(long)peVar32] = (sel_t)uVar35;
              peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33a63;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          peVar32 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (*(byte *)local_498 & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *(long *)(pdVar7 + uVar56 * 8) != *plVar48;
            }
            psVar11[(long)peVar32] = (sel_t)uVar35;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b33a63;
        }
        goto LAB_00b2ff83;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar48 = (long *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b33b15;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *plVar48 != *(long *)(pdVar7 + uVar56 * 8);
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b33b17;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            local_4b8 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = *plVar48 != *(long *)(pdVar7 + uVar56 * 8);
              }
              psVar11[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
            goto LAB_00b30edc;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          local_4b8 = (element_type *)0x0;
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = *plVar48 != *(long *)(pdVar7 + uVar56 * 8);
            }
            psVar11[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b30edc;
        }
        goto LAB_00b3002f;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = (*puVar3 & 1) == 0;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b319c0:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar39 = 0;
              do {
                sVar54 = (sel_t)iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  sVar54 = psVar10[iVar39];
                }
                psVar11[iVar39] = sVar54;
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              return count;
            }
            return count;
          }
        }
        else if (*(long *)left->data != *(long *)right->data) goto LAB_00b319c0;
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          psVar11[iVar39] = sVar54;
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        return (idx_t)(element_type *)0x0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b30dcd;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          lVar57 = 0;
          iVar39 = 0;
          do {
            iVar21 = iVar39;
            if (psVar10 != (sel_t *)0x0) {
              iVar21 = (idx_t)psVar10[iVar39];
            }
            iVar29 = iVar39;
            if (lVar38 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
            }
            iVar41 = iVar39;
            if (psVar11 != (sel_t *)0x0) {
              iVar41 = (idx_t)psVar11[iVar39];
            }
            if (*(long *)(LStack_490._0_8_ + iVar29 * 8) == *(long *)(LStack_420._0_8_ + iVar41 * 8)
               ) {
              (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
              lVar57 = lVar57 + 1;
            }
            iVar39 = iVar39 + 1;
          } while (count != iVar39);
          goto LAB_00b30dcf;
        }
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        local_4b8 = (element_type *)0x0;
        iVar39 = 0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(long *)(LStack_490._0_8_ + iVar29 * 8) != *(long *)(LStack_420._0_8_ + iVar41 * 8))
          {
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
      }
      else {
        if (count == 0) goto LAB_00b2b73c;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        iVar39 = 0;
        peVar32 = (element_type *)0x0;
        peVar25 = (element_type *)0x0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (*(long *)(LStack_490._0_8_ + iVar29 * 8) == *(long *)(LStack_420._0_8_ + iVar41 * 8))
          {
            oVar34.ptr = false_sel.ptr;
            peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
            local_4b8 = peVar25;
          }
          else {
            local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
            oVar34.ptr = true_sel.ptr;
            peVar47 = peVar32;
            peVar32 = peVar25;
          }
          (oVar34.ptr)->sel_vector[(long)peVar32] = (sel_t)iVar21;
          iVar39 = iVar39 + 1;
          peVar32 = peVar47;
          peVar25 = local_4b8;
        } while (count != iVar39);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b30e97;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        lVar57 = 0;
        iVar39 = 0;
        do {
          iVar21 = iVar39;
          if (psVar10 != (sel_t *)0x0) {
            iVar21 = (idx_t)psVar10[iVar39];
          }
          iVar29 = iVar39;
          if (lVar38 != 0) {
            iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
          }
          iVar41 = iVar39;
          if (psVar11 != (sel_t *)0x0) {
            iVar41 = (idx_t)psVar11[iVar39];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            bVar64 = bVar64 == bVar65;
          }
          else {
            bVar64 = *(long *)(LStack_490._0_8_ + iVar29 * 8) ==
                     *(long *)(LStack_420._0_8_ + iVar41 * 8);
          }
          if (bVar64) {
            (false_sel.ptr)->sel_vector[lVar57] = (sel_t)iVar21;
            lVar57 = lVar57 + 1;
          }
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        goto LAB_00b30e99;
      }
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      local_4b8 = (element_type *)0x0;
      iVar39 = 0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(long *)(LStack_490._0_8_ + iVar29 * 8) ==
                   *(long *)(LStack_420._0_8_ + iVar41 * 8);
        }
        if (!bVar64) {
          (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)iVar21;
          local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
        }
        iVar39 = iVar39 + 1;
      } while (count != iVar39);
    }
    else {
      if (count == 0) goto LAB_00b2b73c;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      iVar39 = 0;
      peVar32 = (element_type *)0x0;
      peVar25 = (element_type *)0x0;
      do {
        iVar21 = iVar39;
        if (psVar10 != (sel_t *)0x0) {
          iVar21 = (idx_t)psVar10[iVar39];
        }
        iVar29 = iVar39;
        if (lVar38 != 0) {
          iVar29 = (idx_t)*(uint *)(lVar38 + iVar39 * 4);
        }
        iVar41 = iVar39;
        if (psVar11 != (sel_t *)0x0) {
          iVar41 = (idx_t)psVar11[iVar39];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[iVar41 >> 6] >> (iVar41 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          bVar64 = bVar64 == bVar65;
        }
        else {
          bVar64 = *(long *)(LStack_490._0_8_ + iVar29 * 8) ==
                   *(long *)(LStack_420._0_8_ + iVar41 * 8);
        }
        if (bVar64) {
          local_4b8 = peVar25;
          peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          peVar25 = peVar32;
          oVar34.ptr = false_sel.ptr;
        }
        else {
          local_4b8 = (element_type *)((long)&peVar25->_vptr_ExtraTypeInfo + 1);
          peVar47 = peVar32;
          oVar34.ptr = true_sel.ptr;
        }
        (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)iVar21;
        iVar39 = iVar39 + 1;
        peVar32 = peVar47;
        peVar25 = local_4b8;
      } while (count != iVar39);
    }
    break;
  default:
switchD_00b24607_caseD_a:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_498 = (undefined1  [8])&LStack_490.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,"Invalid type for distinct selection","");
    InternalException::InternalException(this_02,(string *)local_498);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar42 = (float *)left->data;
        pfVar50 = (float *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = Equals::Operation<float>(pfVar42,pfVar50);
              bVar64 = !bVar64;
            }
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            pfVar42 = pfVar42 + 1;
            pfVar50 = pfVar50 + 1;
          } while (count != uVar56);
          return (idx_t)local_4b8;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          uVar56 = 0;
          local_4b8 = (element_type *)0x0;
          do {
            uVar35 = uVar56;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = Equals::Operation<float>(pfVar42,pfVar50);
              bVar64 = !bVar64;
            }
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            uVar56 = uVar56 + 1;
            pfVar42 = pfVar42 + 1;
            pfVar50 = pfVar50 + 1;
          } while (count != uVar56);
          return (idx_t)local_4b8;
        }
        if (count != 0) {
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65 ^ 1);
            }
            else {
              bVar64 = Equals::Operation<float>(pfVar42,pfVar50);
            }
            (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)bVar64;
            uVar56 = uVar56 + 1;
            pfVar42 = pfVar42 + 1;
            pfVar50 = pfVar50 + 1;
          } while (count != uVar56);
          goto LAB_00b32886;
        }
LAB_00b32883:
        lVar38 = 0;
LAB_00b32886:
        return (idx_t)(element_type *)(count - lVar38);
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pfVar42 = (float *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pfVar50 = (float *)left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b3397e;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65 ^ 1);
              }
              else {
                bVar64 = Equals::Operation<float>(pfVar50,pfVar42);
              }
              (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)bVar64;
              uVar56 = uVar56 + 1;
              pfVar50 = pfVar50 + 1;
            } while (count != uVar56);
            goto LAB_00b33981;
          }
          if (count != 0) {
            uVar56 = 0;
            local_4b8 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = Equals::Operation<float>(pfVar50,pfVar42);
                bVar64 = !bVar64;
              }
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
              pfVar50 = pfVar50 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar56);
            goto LAB_00b33993;
          }
        }
        else if (count != 0) {
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (*(byte *)local_498 & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = Equals::Operation<float>(pfVar50,pfVar42);
              bVar64 = !bVar64;
            }
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            pfVar50 = pfVar50 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar56);
          goto LAB_00b33993;
        }
        goto LAB_00b2fecd;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar42 = (float *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pfVar50 = (float *)right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b3397e;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65 ^ 1);
              }
              else {
                bVar64 = Equals::Operation<float>(pfVar42,pfVar50);
              }
              (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)bVar64;
              uVar56 = uVar56 + 1;
              pfVar50 = pfVar50 + 1;
            } while (count != uVar56);
            goto LAB_00b33981;
          }
          if (count != 0) {
            uVar56 = 0;
            local_4b8 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = Equals::Operation<float>(pfVar42,pfVar50);
                bVar64 = !bVar64;
              }
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
              pfVar50 = pfVar50 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar56);
            goto LAB_00b33993;
          }
        }
        else if (count != 0) {
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(byte *)local_498 & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = Equals::Operation<float>(pfVar42,pfVar50);
              bVar64 = !bVar64;
            }
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            pfVar50 = pfVar50 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar56);
          goto LAB_00b33993;
        }
        goto LAB_00b2fecd;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = (*puVar3 & 1) == 0;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b313a7:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar39 = 0;
              do {
                sVar54 = (sel_t)iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  sVar54 = psVar10[iVar39];
                }
                psVar11[iVar39] = sVar54;
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              return count;
            }
            return count;
          }
        }
        else {
          bVar64 = Equals::Operation<float>((float *)left->data,(float *)right->data);
          if (!bVar64) goto LAB_00b313a7;
        }
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          psVar11[iVar39] = sVar54;
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        return (idx_t)(element_type *)0x0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    uVar14 = LStack_490._0_8_;
    uVar16 = LStack_420._0_8_;
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
LAB_00b31186:
            lVar57 = 0;
          }
          else {
            psVar10 = (sel.ptr)->sel_vector;
            lVar38 = *(long *)local_498;
            psVar11 = *(sel_t **)local_428;
            lVar57 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              uVar63 = uVar56;
              if (lVar38 != 0) {
                uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
              }
              uVar33 = uVar56;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar56];
              }
              bVar64 = Equals::Operation<float>
                                 ((float *)(uVar14 + uVar63 * 4),(float *)(uVar16 + uVar33 * 4));
              if (bVar64) {
                (false_sel.ptr)->sel_vector[lVar57] = (sel_t)uVar35;
                lVar57 = lVar57 + 1;
              }
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
          }
LAB_00b31188:
          local_4b8 = (element_type *)(count - lVar57);
        }
        else {
          if (count == 0) goto LAB_00b2ba44;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          uVar56 = 0;
          local_4b8 = (element_type *)0x0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            uVar63 = uVar56;
            if (lVar38 != 0) {
              uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
            }
            uVar33 = uVar56;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar56];
            }
            bVar64 = Equals::Operation<float>
                               ((float *)(uVar14 + uVar63 * 4),(float *)(uVar16 + uVar33 * 4));
            if (!bVar64) {
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
            }
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
        }
      }
      else {
        if (count == 0) goto LAB_00b2ba44;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        peVar32 = (element_type *)0x0;
        local_4b8 = (element_type *)0x0;
        uVar56 = 0;
        do {
          uVar35 = uVar56;
          if (psVar10 != (sel_t *)0x0) {
            uVar35 = (ulong)psVar10[uVar56];
          }
          uVar63 = uVar56;
          if (lVar38 != 0) {
            uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
          }
          uVar33 = uVar56;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar56];
          }
          bVar64 = Equals::Operation<float>
                             ((float *)(uVar14 + uVar63 * 4),(float *)(uVar16 + uVar33 * 4));
          if (bVar64) {
            peVar25 = peVar32;
            oVar34.ptr = false_sel.ptr;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          }
          else {
            peVar25 = local_4b8;
            oVar34.ptr = true_sel.ptr;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)uVar35;
          uVar56 = uVar56 + 1;
        } while (count != uVar56);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b31186;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        lVar57 = 0;
        uVar56 = 0;
        do {
          uVar35 = uVar56;
          if (psVar10 != (sel_t *)0x0) {
            uVar35 = (ulong)psVar10[uVar56];
          }
          uVar63 = uVar56;
          if (lVar38 != 0) {
            uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
          }
          uVar33 = uVar56;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar56];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar63 >> 6) * 8) >> (uVar63 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar33 >> 6] >> (uVar33 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            if (bVar64 == bVar65) {
LAB_00b30149:
              (false_sel.ptr)->sel_vector[lVar57] = (sel_t)uVar35;
              lVar57 = lVar57 + 1;
            }
          }
          else {
            bVar64 = Equals::Operation<float>
                               ((float *)(uVar14 + uVar63 * 4),(float *)(uVar16 + uVar33 * 4));
            if (bVar64) goto LAB_00b30149;
          }
          uVar56 = uVar56 + 1;
        } while (count != uVar56);
        goto LAB_00b31188;
      }
      if (count == 0) goto LAB_00b2ba44;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      uVar56 = 0;
      local_4b8 = (element_type *)0x0;
      do {
        uVar35 = uVar56;
        if (psVar10 != (sel_t *)0x0) {
          uVar35 = (ulong)psVar10[uVar56];
        }
        uVar63 = uVar56;
        if (lVar38 != 0) {
          uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
        }
        uVar33 = uVar56;
        if (psVar11 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar11[uVar56];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar63 >> 6) * 8) >> (uVar63 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b2a8b8:
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
        }
        else {
          bVar64 = Equals::Operation<float>
                             ((float *)(uVar14 + uVar63 * 4),(float *)(uVar16 + uVar33 * 4));
          if (!bVar64) goto LAB_00b2a8b8;
        }
        uVar56 = uVar56 + 1;
      } while (count != uVar56);
    }
    else {
      if (count == 0) goto LAB_00b2ba44;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      local_4b8 = (element_type *)0x0;
      uVar56 = 0;
      peVar32 = (element_type *)0x0;
      do {
        uVar35 = uVar56;
        if (psVar10 != (sel_t *)0x0) {
          uVar35 = (ulong)psVar10[uVar56];
        }
        uVar63 = uVar56;
        if (lVar38 != 0) {
          uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
        }
        uVar33 = uVar56;
        if (psVar11 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar11[uVar56];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar63 >> 6) * 8) >> (uVar63 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 == bVar65) goto LAB_00b28790;
LAB_00b2875d:
          peVar25 = local_4b8;
          oVar34.ptr = true_sel.ptr;
          peVar47 = peVar32;
          local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
        }
        else {
          bVar64 = Equals::Operation<float>
                             ((float *)(uVar14 + uVar63 * 4),(float *)(uVar16 + uVar33 * 4));
          if (!bVar64) goto LAB_00b2875d;
LAB_00b28790:
          peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          peVar25 = peVar32;
          oVar34.ptr = false_sel.ptr;
        }
        (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)uVar35;
        uVar56 = uVar56 + 1;
        peVar32 = peVar47;
      } while (count != uVar56);
    }
    goto LAB_00b31195;
  case DOUBLE:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar43 = (double *)left->data;
        pdVar51 = (double *)right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = Equals::Operation<double>(pdVar43,pdVar51);
              bVar64 = !bVar64;
            }
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            pdVar43 = pdVar43 + 1;
            pdVar51 = pdVar51 + 1;
          } while (count != uVar56);
          return (idx_t)local_4b8;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          uVar56 = 0;
          local_4b8 = (element_type *)0x0;
          do {
            uVar35 = uVar56;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = Equals::Operation<double>(pdVar43,pdVar51);
              bVar64 = !bVar64;
            }
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            uVar56 = uVar56 + 1;
            pdVar43 = pdVar43 + 1;
            pdVar51 = pdVar51 + 1;
          } while (count != uVar56);
          return (idx_t)local_4b8;
        }
        if (count != 0) {
          lVar38 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65 ^ 1);
            }
            else {
              bVar64 = Equals::Operation<double>(pdVar43,pdVar51);
            }
            (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)bVar64;
            uVar56 = uVar56 + 1;
            pdVar43 = pdVar43 + 1;
            pdVar51 = pdVar51 + 1;
          } while (count != uVar56);
          goto LAB_00b32886;
        }
        goto LAB_00b32883;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar43 = (double *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar51 = (double *)left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b3397e;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65 ^ 1);
              }
              else {
                bVar64 = Equals::Operation<double>(pdVar51,pdVar43);
              }
              (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)bVar64;
              uVar56 = uVar56 + 1;
              pdVar51 = pdVar51 + 1;
            } while (count != uVar56);
            goto LAB_00b33981;
          }
          if (count != 0) {
            uVar56 = 0;
            local_4b8 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = Equals::Operation<double>(pdVar51,pdVar43);
                bVar64 = !bVar64;
              }
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
              pdVar51 = pdVar51 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar56);
            goto LAB_00b33993;
          }
        }
        else if (count != 0) {
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
            }
            puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (*(byte *)local_498 & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = Equals::Operation<double>(pdVar51,pdVar43);
              bVar64 = !bVar64;
            }
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            pdVar51 = pdVar51 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar56);
          goto LAB_00b33993;
        }
        goto LAB_00b2fecd;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar43 = (double *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar51 = (double *)right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b3397e;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65 ^ 1);
              }
              else {
                bVar64 = Equals::Operation<double>(pdVar43,pdVar51);
              }
              (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)bVar64;
              uVar56 = uVar56 + 1;
              pdVar51 = pdVar51 + 1;
            } while (count != uVar56);
            goto LAB_00b33981;
          }
          if (count != 0) {
            uVar56 = 0;
            local_4b8 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                bVar64 = Equals::Operation<double>(pdVar43,pdVar51);
                bVar64 = !bVar64;
              }
              (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
              pdVar51 = pdVar51 + 1;
              local_478._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_490.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar56);
            goto LAB_00b33993;
          }
        }
        else if (count != 0) {
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar35 = (ulong)(sel.ptr)->sel_vector[uVar56];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(byte *)local_498 & 1) == 0;
            }
            puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              bVar64 = Equals::Operation<double>(pdVar43,pdVar51);
              bVar64 = !bVar64;
            }
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            pdVar51 = pdVar51 + 1;
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar56);
          goto LAB_00b33993;
        }
        goto LAB_00b2fecd;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = (*puVar3 & 1) == 0;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b31618:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar39 = 0;
              do {
                sVar54 = (sel_t)iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  sVar54 = psVar10[iVar39];
                }
                psVar11[iVar39] = sVar54;
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              return count;
            }
            return count;
          }
        }
        else {
          bVar64 = Equals::Operation<double>((double *)left->data,(double *)right->data);
          if (!bVar64) goto LAB_00b31618;
        }
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          psVar11[iVar39] = sVar54;
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        return (idx_t)(element_type *)0x0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    uVar14 = LStack_490._0_8_;
    uVar16 = LStack_420._0_8_;
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_00b31186;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          lVar57 = 0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            uVar63 = uVar56;
            if (lVar38 != 0) {
              uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
            }
            uVar33 = uVar56;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar56];
            }
            bVar64 = Equals::Operation<double>
                               ((double *)(uVar14 + uVar63 * 8),(double *)(uVar16 + uVar33 * 8));
            if (bVar64) {
              (false_sel.ptr)->sel_vector[lVar57] = (sel_t)uVar35;
              lVar57 = lVar57 + 1;
            }
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
          goto LAB_00b31188;
        }
        if (count == 0) goto LAB_00b2ba44;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        uVar56 = 0;
        local_4b8 = (element_type *)0x0;
        do {
          uVar35 = uVar56;
          if (psVar10 != (sel_t *)0x0) {
            uVar35 = (ulong)psVar10[uVar56];
          }
          uVar63 = uVar56;
          if (lVar38 != 0) {
            uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
          }
          uVar33 = uVar56;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar56];
          }
          bVar64 = Equals::Operation<double>
                             ((double *)(uVar14 + uVar63 * 8),(double *)(uVar16 + uVar33 * 8));
          if (!bVar64) {
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          uVar56 = uVar56 + 1;
        } while (count != uVar56);
      }
      else {
        if (count == 0) goto LAB_00b2ba44;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        peVar32 = (element_type *)0x0;
        local_4b8 = (element_type *)0x0;
        uVar56 = 0;
        do {
          uVar35 = uVar56;
          if (psVar10 != (sel_t *)0x0) {
            uVar35 = (ulong)psVar10[uVar56];
          }
          uVar63 = uVar56;
          if (lVar38 != 0) {
            uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
          }
          uVar33 = uVar56;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar56];
          }
          bVar64 = Equals::Operation<double>
                             ((double *)(uVar14 + uVar63 * 8),(double *)(uVar16 + uVar33 * 8));
          if (bVar64) {
            peVar25 = peVar32;
            oVar34.ptr = false_sel.ptr;
            peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          }
          else {
            peVar25 = local_4b8;
            oVar34.ptr = true_sel.ptr;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)uVar35;
          uVar56 = uVar56 + 1;
        } while (count != uVar56);
      }
    }
    else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
      if (true_sel.ptr == (SelectionVector *)0x0) {
        if (count == 0) goto LAB_00b31186;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        lVar57 = 0;
        uVar56 = 0;
        do {
          uVar35 = uVar56;
          if (psVar10 != (sel_t *)0x0) {
            uVar35 = (ulong)psVar10[uVar56];
          }
          uVar63 = uVar56;
          if (lVar38 != 0) {
            uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
          }
          uVar33 = uVar56;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar56];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar63 >> 6) * 8) >> (uVar63 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar33 >> 6] >> (uVar33 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            if (bVar64 == bVar65) {
LAB_00b30625:
              (false_sel.ptr)->sel_vector[lVar57] = (sel_t)uVar35;
              lVar57 = lVar57 + 1;
            }
          }
          else {
            bVar64 = Equals::Operation<double>
                               ((double *)(uVar14 + uVar63 * 8),(double *)(uVar16 + uVar33 * 8));
            if (bVar64) goto LAB_00b30625;
          }
          uVar56 = uVar56 + 1;
        } while (count != uVar56);
        goto LAB_00b31188;
      }
      if (count == 0) goto LAB_00b2ba44;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      uVar56 = 0;
      local_4b8 = (element_type *)0x0;
      do {
        uVar35 = uVar56;
        if (psVar10 != (sel_t *)0x0) {
          uVar35 = (ulong)psVar10[uVar56];
        }
        uVar63 = uVar56;
        if (lVar38 != 0) {
          uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
        }
        uVar33 = uVar56;
        if (psVar11 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar11[uVar56];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar63 >> 6) * 8) >> (uVar63 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b2ade2:
            (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
        }
        else {
          bVar64 = Equals::Operation<double>
                             ((double *)(uVar14 + uVar63 * 8),(double *)(uVar16 + uVar33 * 8));
          if (!bVar64) goto LAB_00b2ade2;
        }
        uVar56 = uVar56 + 1;
      } while (count != uVar56);
    }
    else {
      if (count == 0) goto LAB_00b2ba44;
      psVar10 = (sel.ptr)->sel_vector;
      lVar38 = *(long *)local_498;
      psVar11 = *(sel_t **)local_428;
      local_4b8 = (element_type *)0x0;
      uVar56 = 0;
      peVar32 = (element_type *)0x0;
      do {
        uVar35 = uVar56;
        if (psVar10 != (sel_t *)0x0) {
          uVar35 = (ulong)psVar10[uVar56];
        }
        uVar63 = uVar56;
        if (lVar38 != 0) {
          uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
        }
        uVar33 = uVar56;
        if (psVar11 != (sel_t *)0x0) {
          uVar33 = (ulong)psVar11[uVar56];
        }
        if (LStack_490.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar63 >> 6) * 8) >> (uVar63 & 0x3f) & 1) == 0;
        }
        if (LStack_420.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_vptr_ExtraTypeInfo)[uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0
          ;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 == bVar65) goto LAB_00b28ac0;
LAB_00b28a8d:
          peVar25 = local_4b8;
          oVar34.ptr = true_sel.ptr;
          peVar47 = peVar32;
          local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
        }
        else {
          bVar64 = Equals::Operation<double>
                             ((double *)(uVar14 + uVar63 * 8),(double *)(uVar16 + uVar33 * 8));
          if (!bVar64) goto LAB_00b28a8d;
LAB_00b28ac0:
          peVar47 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
          peVar25 = peVar32;
          oVar34.ptr = false_sel.ptr;
        }
        (oVar34.ptr)->sel_vector[(long)peVar25] = (sel_t)uVar35;
        uVar56 = uVar56 + 1;
        peVar32 = peVar47;
      } while (count != uVar56);
    }
    goto LAB_00b31195;
  case INTERVAL:
    local_288 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_288);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_288);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_288);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar9 = right->data;
        FlatVector::VerifyFlatVector(left);
        FlatVector::VerifyFlatVector(right);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          if (count == 0) {
            return (idx_t)(element_type *)0x0;
          }
          psVar10 = (sel.ptr)->sel_vector;
          psVar11 = (true_sel.ptr)->sel_vector;
          psVar8 = (false_sel.ptr)->sel_vector;
          lVar57 = 8;
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (puVar3 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              iVar46 = *(int *)(pdVar7 + lVar57 + -4);
              iVar62 = *(int *)(pdVar9 + lVar57 + -4);
              lVar55 = *(long *)(pdVar7 + lVar57);
              lVar61 = *(long *)(pdVar9 + lVar57);
              if (((*(int *)(pdVar7 + lVar57 + -8) == *(int *)(pdVar9 + lVar57 + -8)) &&
                  (iVar46 == iVar62)) && (iVar62 = iVar46, lVar55 == lVar61)) {
                bVar64 = false;
              }
              else {
                lVar58 = (long)iVar46 + lVar55 / 86400000000;
                lVar60 = (long)iVar62 + lVar61 / 86400000000;
                bVar64 = true;
                if (((long)*(int *)(pdVar7 + lVar57 + -8) + lVar58 / 0x1e ==
                     (long)*(int *)(pdVar9 + lVar57 + -8) + lVar60 / 0x1e) &&
                   (bVar64 = true, lVar58 % 0x1e == lVar60 % 0x1e)) {
                  bVar64 = lVar55 % 86400000000 != lVar61 % 86400000000;
                }
              }
            }
            psVar11[(long)local_4b8] = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar8[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            lVar57 = lVar57 + 0x10;
          } while (count != uVar56);
          return (idx_t)local_4b8;
        }
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            lVar38 = 0;
          }
          else {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            lVar57 = 8;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (puVar3 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                iVar46 = *(int *)(pdVar7 + lVar57 + -4);
                iVar62 = *(int *)(pdVar9 + lVar57 + -4);
                lVar55 = *(long *)(pdVar7 + lVar57);
                lVar61 = *(long *)(pdVar9 + lVar57);
                if (((*(int *)(pdVar7 + lVar57 + -8) == *(int *)(pdVar9 + lVar57 + -8)) &&
                    (iVar46 == iVar62)) && (iVar62 = iVar46, lVar55 == lVar61)) {
                  bVar64 = false;
                }
                else {
                  lVar58 = (long)iVar46 + lVar55 / 86400000000;
                  lVar60 = (long)iVar62 + lVar61 / 86400000000;
                  bVar64 = true;
                  if (((long)*(int *)(pdVar7 + lVar57 + -8) + lVar58 / 0x1e ==
                       (long)*(int *)(pdVar9 + lVar57 + -8) + lVar60 / 0x1e) &&
                     (bVar64 = true, lVar58 % 0x1e == lVar60 % 0x1e)) {
                    bVar64 = lVar55 % 86400000000 != lVar61 % 86400000000;
                  }
                }
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
              lVar57 = lVar57 + 0x10;
            } while (count != uVar56);
          }
          return (idx_t)(element_type *)(count - lVar38);
        }
        if (count == 0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (true_sel.ptr)->sel_vector;
        lVar38 = 8;
        uVar56 = 0;
        local_4b8 = (element_type *)0x0;
        do {
          uVar35 = uVar56;
          if (psVar10 != (sel_t *)0x0) {
            uVar35 = (ulong)psVar10[uVar56];
          }
          if (puVar2 == (unsigned_long *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
          }
          if (puVar3 == (unsigned_long *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = (puVar3[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            bVar64 = (bool)(bVar64 ^ bVar65);
          }
          else {
            iVar46 = *(int *)(pdVar7 + lVar38 + -4);
            iVar62 = *(int *)(pdVar9 + lVar38 + -4);
            lVar57 = *(long *)(pdVar7 + lVar38);
            lVar55 = *(long *)(pdVar9 + lVar38);
            if (((*(int *)(pdVar7 + lVar38 + -8) == *(int *)(pdVar9 + lVar38 + -8)) &&
                (iVar46 == iVar62)) && (iVar62 = iVar46, lVar57 == lVar55)) {
              bVar64 = false;
            }
            else {
              lVar61 = (long)iVar46 + lVar57 / 86400000000;
              lVar58 = (long)iVar62 + lVar55 / 86400000000;
              bVar64 = true;
              if (((long)*(int *)(pdVar7 + lVar38 + -8) + lVar61 / 0x1e ==
                   (long)*(int *)(pdVar9 + lVar38 + -8) + lVar58 / 0x1e) &&
                 (bVar64 = true, lVar61 % 0x1e == lVar58 % 0x1e)) {
                bVar64 = lVar57 % 86400000000 != lVar55 % 86400000000;
              }
            }
          }
          psVar11[(long)local_4b8] = (sel_t)uVar35;
          local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
          uVar56 = uVar56 + 1;
          lVar38 = lVar38 + 0x10;
        } while (count != uVar56);
        return (idx_t)local_4b8;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar24 = (int *)right->data;
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = left->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_478._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_00b3397e:
              lVar38 = 0;
            }
            else {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (false_sel.ptr)->sel_vector;
              plVar48 = (long *)(pdVar7 + 8);
              lVar38 = 0;
              uVar56 = 0;
              do {
                uVar35 = uVar56;
                if (psVar10 != (sel_t *)0x0) {
                  uVar35 = (ulong)psVar10[uVar56];
                }
                if (puVar2 == (unsigned_long *)0x0) {
                  bVar64 = false;
                }
                else {
                  bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
                }
                if (local_498 == (undefined1  [8])0x0) {
                  bVar65 = false;
                }
                else {
                  bVar65 = (*(byte *)local_498 & 1) == 0;
                }
                if ((bVar64 | bVar65) == 1) {
                  bVar64 = (bool)(bVar64 ^ bVar65);
                }
                else {
                  iVar46 = *(int *)((long)plVar48 + -4);
                  lVar57 = *plVar48;
                  lVar55 = *(long *)(piVar24 + 2);
                  iVar62 = piVar24[1];
                  if ((piVar24[1] == iVar46 && *piVar24 == (int)plVar48[-1]) &&
                     (iVar62 = iVar46, lVar57 == lVar55)) {
                    bVar64 = false;
                  }
                  else {
                    lVar61 = (long)iVar46 + lVar57 / 86400000000;
                    lVar58 = (long)iVar62 + lVar55 / 86400000000;
                    bVar64 = true;
                    if (((long)(int)plVar48[-1] + lVar61 / 0x1e == (long)*piVar24 + lVar58 / 0x1e)
                       && (bVar64 = true, lVar61 % 0x1e == lVar58 % 0x1e)) {
                      bVar64 = lVar57 % 86400000000 != lVar55 % 86400000000;
                    }
                  }
                }
                psVar11[lVar38] = (sel_t)uVar35;
                lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
                uVar56 = uVar56 + 1;
                plVar48 = plVar48 + 2;
              } while (count != uVar56);
            }
LAB_00b33981:
            local_4b8 = (element_type *)(count - lVar38);
            local_478._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_490.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_00b33993;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            plVar48 = (long *)(pdVar7 + 8);
            uVar56 = 0;
            local_4b8 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (*(byte *)local_498 & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                iVar46 = *(int *)((long)plVar48 + -4);
                lVar38 = *plVar48;
                lVar57 = *(long *)(piVar24 + 2);
                iVar62 = piVar24[1];
                if ((piVar24[1] == iVar46 && *piVar24 == (int)plVar48[-1]) &&
                   (iVar62 = iVar46, lVar38 == lVar57)) {
                  bVar64 = false;
                }
                else {
                  lVar55 = (long)iVar46 + lVar38 / 86400000000;
                  lVar61 = (long)iVar62 + lVar57 / 86400000000;
                  bVar64 = true;
                  if (((long)(int)plVar48[-1] + lVar55 / 0x1e == (long)*piVar24 + lVar61 / 0x1e) &&
                     (bVar64 = true, lVar55 % 0x1e == lVar61 % 0x1e)) {
                    bVar64 = lVar38 % 86400000000 != lVar57 % 86400000000;
                  }
                }
              }
              psVar11[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
              plVar48 = plVar48 + 2;
            } while (count != uVar56);
            goto LAB_00b33993;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          local_430.ptr = (ValidityMask *)(true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          plVar48 = (long *)(pdVar7 + 8);
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (*(byte *)local_498 & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              iVar46 = *(int *)((long)plVar48 + -4);
              lVar57 = *plVar48;
              lVar55 = *(long *)(piVar24 + 2);
              iVar62 = piVar24[1];
              if ((piVar24[1] == iVar46 && *piVar24 == (int)plVar48[-1]) &&
                 (iVar62 = iVar46, lVar57 == lVar55)) {
                bVar64 = false;
              }
              else {
                lVar61 = (long)iVar46 + lVar57 / 86400000000;
                lVar58 = (long)iVar62 + lVar55 / 86400000000;
                bVar64 = true;
                if (((long)(int)plVar48[-1] + lVar61 / 0x1e == (long)*piVar24 + lVar58 / 0x1e) &&
                   (bVar64 = true, lVar61 % 0x1e == lVar58 % 0x1e)) {
                  bVar64 = lVar57 % 86400000000 != lVar55 % 86400000000;
                }
              }
            }
            *(sel_t *)((long)&((element_type *)local_430.ptr)->_vptr_ExtraTypeInfo +
                      (long)local_4b8 * 4) = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar11[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            plVar48 = plVar48 + 2;
          } while (count != uVar56);
          goto LAB_00b33993;
        }
LAB_00b2fecd:
        local_4b8 = (element_type *)0x0;
        local_478._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        goto LAB_00b33993;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar24 = (int *)left->data;
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pdVar7 = right->data;
        _local_498 = (undefined1  [16])0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          local_308._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_428,(unsigned_long *)&local_308);
          peVar32 = LStack_490.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar15 = local_428;
          LStack_490.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_420._0_8_;
          _local_428 = (undefined1  [16])0x0;
          auVar13 = _local_428;
          local_428[0] = auVar15[0];
          local_428[1] = auVar15[1];
          local_428._2_6_ = auVar15._2_6_;
          LStack_490.id_ = local_428[0];
          LStack_490.physical_type_ = local_428[1];
          LStack_490._2_6_ = local_428._2_6_;
          _local_428 = auVar13;
          if (peVar32 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_420._0_8_);
            }
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_498 + 8));
          local_498 = *(undefined1 (*) [8])
                       &(pTVar31->owned_data).
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>;
          *(undefined8 *)local_498 = 0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_478._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             LStack_490.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_00b3397e;
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (false_sel.ptr)->sel_vector;
            plVar48 = (long *)(pdVar7 + 8);
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                iVar46 = piVar24[1];
                lVar57 = *(long *)(piVar24 + 2);
                lVar55 = *plVar48;
                iVar62 = *(int *)((long)plVar48 + -4);
                if ((*(int *)((long)plVar48 + -4) == iVar46 && (int)plVar48[-1] == *piVar24) &&
                   (iVar62 = iVar46, lVar57 == lVar55)) {
                  bVar64 = false;
                }
                else {
                  lVar61 = (long)iVar46 + lVar57 / 86400000000;
                  lVar58 = (long)iVar62 + lVar55 / 86400000000;
                  bVar64 = true;
                  if (((long)*piVar24 + lVar61 / 0x1e == (long)(int)plVar48[-1] + lVar58 / 0x1e) &&
                     (bVar64 = true, lVar61 % 0x1e == lVar58 % 0x1e)) {
                    bVar64 = lVar57 % 86400000000 != lVar55 % 86400000000;
                  }
                }
              }
              psVar11[lVar38] = (sel_t)uVar35;
              lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
              uVar56 = uVar56 + 1;
              plVar48 = plVar48 + 2;
            } while (count != uVar56);
            goto LAB_00b33981;
          }
          if (count != 0) {
            psVar10 = (sel.ptr)->sel_vector;
            psVar11 = (true_sel.ptr)->sel_vector;
            plVar48 = (long *)(pdVar7 + 8);
            uVar56 = 0;
            local_4b8 = (element_type *)0x0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              if (local_498 == (undefined1  [8])0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(byte *)local_498 & 1) == 0;
              }
              if (puVar2 == (unsigned_long *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                bVar64 = (bool)(bVar64 ^ bVar65);
              }
              else {
                iVar46 = piVar24[1];
                lVar38 = *(long *)(piVar24 + 2);
                lVar57 = *plVar48;
                iVar62 = *(int *)((long)plVar48 + -4);
                if ((*(int *)((long)plVar48 + -4) == iVar46 && (int)plVar48[-1] == *piVar24) &&
                   (iVar62 = iVar46, lVar38 == lVar57)) {
                  bVar64 = false;
                }
                else {
                  lVar55 = (long)iVar46 + lVar38 / 86400000000;
                  lVar61 = (long)iVar62 + lVar57 / 86400000000;
                  bVar64 = true;
                  if (((long)*piVar24 + lVar55 / 0x1e == (long)(int)plVar48[-1] + lVar61 / 0x1e) &&
                     (bVar64 = true, lVar55 % 0x1e == lVar61 % 0x1e)) {
                    bVar64 = lVar38 % 86400000000 != lVar57 % 86400000000;
                  }
                }
              }
              psVar11[(long)local_4b8] = (sel_t)uVar35;
              local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
              uVar56 = uVar56 + 1;
              plVar48 = plVar48 + 2;
            } while (count != uVar56);
            goto LAB_00b33993;
          }
        }
        else if (count != 0) {
          psVar10 = (sel.ptr)->sel_vector;
          local_430.ptr = (ValidityMask *)(true_sel.ptr)->sel_vector;
          psVar11 = (false_sel.ptr)->sel_vector;
          plVar48 = (long *)(pdVar7 + 8);
          lVar38 = 0;
          local_4b8 = (element_type *)0x0;
          uVar56 = 0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            if (local_498 == (undefined1  [8])0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(byte *)local_498 & 1) == 0;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = (puVar2[uVar56 >> 6] >> (uVar56 & 0x3f) & 1) == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              bVar64 = (bool)(bVar64 ^ bVar65);
            }
            else {
              iVar46 = piVar24[1];
              lVar57 = *(long *)(piVar24 + 2);
              lVar55 = *plVar48;
              iVar62 = *(int *)((long)plVar48 + -4);
              if ((*(int *)((long)plVar48 + -4) == iVar46 && (int)plVar48[-1] == *piVar24) &&
                 (iVar62 = iVar46, lVar57 == lVar55)) {
                bVar64 = false;
              }
              else {
                lVar61 = (long)iVar46 + lVar57 / 86400000000;
                lVar58 = (long)iVar62 + lVar55 / 86400000000;
                bVar64 = true;
                if (((long)*piVar24 + lVar61 / 0x1e == (long)(int)plVar48[-1] + lVar58 / 0x1e) &&
                   (bVar64 = true, lVar61 % 0x1e == lVar58 % 0x1e)) {
                  bVar64 = lVar57 % 86400000000 != lVar55 % 86400000000;
                }
              }
            }
            *(sel_t *)((long)&((element_type *)local_430.ptr)->_vptr_ExtraTypeInfo +
                      (long)local_4b8 * 4) = (sel_t)uVar35;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + (ulong)bVar64);
            psVar11[lVar38] = (sel_t)uVar35;
            lVar38 = lVar38 + (ulong)(bVar64 ^ 1);
            uVar56 = uVar56 + 1;
            plVar48 = plVar48 + 2;
          } while (count != uVar56);
          goto LAB_00b33993;
        }
        goto LAB_00b2fecd;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          bVar64 = false;
        }
        else {
          bVar64 = (*puVar2 & 1) == 0;
        }
        if (puVar3 == (unsigned_long *)0x0) {
          bVar65 = false;
        }
        else {
          bVar65 = (*puVar3 & 1) == 0;
        }
        if ((bVar64 | bVar65) == 1) {
          if (bVar64 != bVar65) {
LAB_00b31555:
            if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
              psVar10 = (sel.ptr)->sel_vector;
              psVar11 = (true_sel.ptr)->sel_vector;
              iVar39 = 0;
              do {
                sVar54 = (sel_t)iVar39;
                if (psVar10 != (sel_t *)0x0) {
                  sVar54 = psVar10[iVar39];
                }
                psVar11[iVar39] = sVar54;
                iVar39 = iVar39 + 1;
              } while (count != iVar39);
              return count;
            }
            return count;
          }
        }
        else {
          piVar24 = (int *)left->data;
          piVar36 = (int *)right->data;
          iVar46 = piVar24[1];
          lVar38 = *(long *)(piVar24 + 2);
          lVar57 = *(long *)(piVar36 + 2);
          iVar62 = piVar36[1];
          if ((piVar36[1] != iVar46 || *piVar36 != *piVar24) || (iVar62 = iVar46, lVar38 != lVar57))
          {
            lVar55 = (long)iVar46 + lVar38 / 86400000000;
            lVar61 = (long)iVar62 + lVar57 / 86400000000;
            if (((long)*piVar24 + lVar55 / 0x1e != (long)*piVar36 + lVar61 / 0x1e) ||
               ((lVar55 % 0x1e != lVar61 % 0x1e || (lVar38 % 86400000000 != lVar57 % 86400000000))))
            goto LAB_00b31555;
          }
        }
        if (count == 0 || false_sel.ptr == (SelectionVector *)0x0) {
          return (idx_t)(element_type *)0x0;
        }
        psVar10 = (sel.ptr)->sel_vector;
        psVar11 = (false_sel.ptr)->sel_vector;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          psVar11[iVar39] = sVar54;
          iVar39 = iVar39 + 1;
        } while (count != iVar39);
        return (idx_t)(element_type *)0x0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_428);
    if (LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            local_4b8 = (element_type *)0x0;
          }
          else {
            psVar10 = (sel.ptr)->sel_vector;
            lVar38 = *(long *)local_498;
            psVar11 = *(sel_t **)local_428;
            local_4b8 = (element_type *)0x0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              uVar63 = uVar56;
              if (lVar38 != 0) {
                uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
              }
              uVar33 = uVar56;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar56];
              }
              lVar61 = uVar33 * 0x10;
              iVar46 = *(int *)(LStack_490._0_8_ + uVar63 * 0x10 + 4);
              iVar62 = *(int *)(LStack_420._0_8_ + lVar61 + 4);
              lVar57 = *(long *)(LStack_490._0_8_ + (uVar63 * 2 + 1) * 8);
              lVar55 = *(long *)(LStack_420._0_8_ + lVar61 + 8);
              if (((*(int *)(LStack_490._0_8_ + uVar63 * 0x10) ==
                    *(int *)(LStack_420._0_8_ + lVar61)) && (iVar46 == iVar62)) &&
                 (iVar62 = iVar46, lVar57 == lVar55)) {
LAB_00b302e3:
                (false_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
                local_4b8 = (element_type *)((long)local_4b8 + 1);
              }
              else {
                lVar58 = (long)iVar46 + lVar57 / 86400000000;
                lVar60 = (long)iVar62 + lVar55 / 86400000000;
                if ((((long)*(int *)(LStack_490._0_8_ + uVar63 * 0x10) + lVar58 / 0x1e ==
                      (long)*(int *)(LStack_420._0_8_ + lVar61) + lVar60 / 0x1e) &&
                    (lVar58 % 0x1e == lVar60 % 0x1e)) &&
                   (lVar57 % 86400000000 == lVar55 % 86400000000)) goto LAB_00b302e3;
              }
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
          }
          local_4b8 = (element_type *)(count - (long)local_4b8);
        }
        else {
          if (count == 0) goto LAB_00b2ba44;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          uVar56 = 0;
          local_4b8 = (element_type *)0x0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            uVar63 = uVar56;
            if (lVar38 != 0) {
              uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
            }
            uVar33 = uVar56;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar56];
            }
            lVar61 = uVar33 * 0x10;
            iVar46 = *(int *)(LStack_490._0_8_ + uVar63 * 0x10 + 4);
            iVar62 = *(int *)(LStack_420._0_8_ + lVar61 + 4);
            lVar57 = *(long *)(LStack_490._0_8_ + (uVar63 * 2 + 1) * 8);
            lVar55 = *(long *)(LStack_420._0_8_ + lVar61 + 8);
            if (((*(int *)(LStack_490._0_8_ + uVar63 * 0x10) != *(int *)(LStack_420._0_8_ + lVar61))
                || (iVar46 != iVar62)) || (iVar62 = iVar46, lVar57 != lVar55)) {
              lVar58 = (long)iVar46 + lVar57 / 86400000000;
              lVar60 = (long)iVar62 + lVar55 / 86400000000;
              if ((((long)*(int *)(LStack_490._0_8_ + uVar63 * 0x10) + lVar58 / 0x1e !=
                    (long)*(int *)(LStack_420._0_8_ + lVar61) + lVar60 / 0x1e) ||
                  (lVar58 % 0x1e != lVar60 % 0x1e)) ||
                 (lVar57 % 86400000000 != lVar55 % 86400000000)) {
                (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
                local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
              }
            }
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
        }
      }
      else if (count == 0) {
LAB_00b2ba44:
        local_4b8 = (element_type *)0x0;
      }
      else {
        psVar10 = (sel.ptr)->sel_vector;
        local_430.ptr = *(ValidityMask **)local_498;
        psVar11 = *(sel_t **)local_428;
        local_3b8 = (element_type *)0x0;
        local_4b8 = (element_type *)0x0;
        uVar56 = 0;
        do {
          uVar35 = uVar56;
          if (psVar10 != (sel_t *)0x0) {
            uVar35 = (ulong)psVar10[uVar56];
          }
          uVar63 = uVar56;
          if ((element_type *)local_430.ptr != (element_type *)0x0) {
            uVar63 = (ulong)*(uint *)((long)&((element_type *)local_430.ptr)->_vptr_ExtraTypeInfo +
                                     uVar56 * 4);
          }
          uVar33 = uVar56;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar56];
          }
          lVar55 = uVar33 * 0x10;
          iVar46 = *(int *)(LStack_490._0_8_ + uVar63 * 0x10 + 4);
          iVar62 = *(int *)(LStack_420._0_8_ + lVar55 + 4);
          lVar38 = *(long *)(LStack_490._0_8_ + (uVar63 * 2 + 1) * 8);
          lVar57 = *(long *)(LStack_420._0_8_ + lVar55 + 8);
          if (((*(int *)(LStack_490._0_8_ + uVar63 * 0x10) == *(int *)(LStack_420._0_8_ + lVar55))
              && (iVar46 == iVar62)) && (iVar62 = iVar46, lVar38 == lVar57)) {
LAB_00b267e9:
            peVar32 = local_3b8;
            oVar34.ptr = false_sel.ptr;
            local_3b8 = (element_type *)((long)&local_3b8->_vptr_ExtraTypeInfo + 1);
          }
          else {
            lVar61 = (long)iVar46 + lVar38 / 86400000000;
            lVar58 = (long)iVar62 + lVar57 / 86400000000;
            if ((((long)*(int *)(LStack_490._0_8_ + uVar63 * 0x10) + lVar61 / 0x1e ==
                  (long)*(int *)(LStack_420._0_8_ + lVar55) + lVar58 / 0x1e) &&
                (lVar61 % 0x1e == lVar58 % 0x1e)) && (lVar38 % 86400000000 == lVar57 % 86400000000))
            goto LAB_00b267e9;
            peVar32 = local_4b8;
            oVar34.ptr = true_sel.ptr;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          (oVar34.ptr)->sel_vector[(long)peVar32] = (sel_t)uVar35;
          uVar56 = uVar56 + 1;
        } while (count != uVar56);
      }
    }
    else {
      local_430.ptr =
           (ValidityMask *)
           LStack_490.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_3b8 = LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
            lVar38 = 0;
          }
          else {
            psVar10 = (sel.ptr)->sel_vector;
            lVar57 = *(long *)local_498;
            psVar11 = *(sel_t **)local_428;
            lVar38 = 0;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar56];
              }
              uVar63 = uVar56;
              if (lVar57 != 0) {
                uVar63 = (ulong)*(uint *)(lVar57 + uVar56 * 4);
              }
              uVar33 = uVar56;
              if (psVar11 != (sel_t *)0x0) {
                uVar33 = (ulong)psVar11[uVar56];
              }
              if (LStack_490.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar64 = false;
              }
              else {
                bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (uVar63 >> 6) * 8) >> (uVar63 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_420.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar65 = false;
              }
              else {
                bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[uVar33 >> 6] >> (uVar33 & 0x3f) &
                         1) == 0;
              }
              if ((bVar64 | bVar65) == 1) {
                if (bVar64 == bVar65) goto LAB_00b304cd;
              }
              else {
                piVar24 = (int *)(LStack_490._0_8_ + uVar63 * 0x10);
                piVar36 = (int *)(LStack_420._0_8_ + uVar33 * 0x10);
                iVar46 = piVar24[1];
                iVar62 = piVar36[1];
                lVar55 = *(long *)(piVar24 + 2);
                lVar61 = *(long *)(piVar36 + 2);
                if (((*piVar24 != *piVar36) || (iVar46 != iVar62)) ||
                   (iVar62 = iVar46, lVar55 != lVar61)) {
                  lVar58 = (long)iVar46 + lVar55 / 86400000000;
                  lVar60 = (long)iVar62 + lVar61 / 86400000000;
                  if ((((long)*piVar24 + lVar58 / 0x1e != (long)*piVar36 + lVar60 / 0x1e) ||
                      (lVar58 % 0x1e != lVar60 % 0x1e)) ||
                     (lVar55 % 86400000000 != lVar61 % 86400000000)) goto LAB_00b304f8;
                }
LAB_00b304cd:
                (false_sel.ptr)->sel_vector[lVar38] = (sel_t)uVar35;
                lVar38 = lVar38 + 1;
              }
LAB_00b304f8:
              uVar56 = uVar56 + 1;
            } while (count != uVar56);
          }
          local_4b8 = (element_type *)(count - lVar38);
        }
        else {
          if (count == 0) goto LAB_00b2ba44;
          psVar10 = (sel.ptr)->sel_vector;
          lVar38 = *(long *)local_498;
          psVar11 = *(sel_t **)local_428;
          uVar56 = 0;
          local_4b8 = (element_type *)0x0;
          do {
            uVar35 = uVar56;
            if (psVar10 != (sel_t *)0x0) {
              uVar35 = (ulong)psVar10[uVar56];
            }
            uVar63 = uVar56;
            if (lVar38 != 0) {
              uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
            }
            uVar33 = uVar56;
            if (psVar11 != (sel_t *)0x0) {
              uVar33 = (ulong)psVar11[uVar56];
            }
            if (LStack_490.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar64 = false;
            }
            else {
              bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (uVar63 >> 6) * 8) >> (uVar63 & 0x3f) & 1) == 0;
            }
            if (LStack_420.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar65 = false;
            }
            else {
              bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[uVar33 >> 6] >> (uVar33 & 0x3f) & 1)
                       == 0;
            }
            if ((bVar64 | bVar65) == 1) {
              if (bVar64 != bVar65) {
LAB_00b2ac6f:
                (true_sel.ptr)->sel_vector[(long)local_4b8] = (sel_t)uVar35;
                local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
              }
            }
            else {
              piVar24 = (int *)(LStack_490._0_8_ + uVar63 * 0x10);
              piVar36 = (int *)(LStack_420._0_8_ + uVar33 * 0x10);
              iVar46 = piVar24[1];
              iVar62 = piVar36[1];
              lVar57 = *(long *)(piVar24 + 2);
              lVar55 = *(long *)(piVar36 + 2);
              if (((*piVar24 != *piVar36) || (iVar46 != iVar62)) ||
                 (iVar62 = iVar46, lVar57 != lVar55)) {
                lVar61 = (long)iVar46 + lVar57 / 86400000000;
                lVar58 = (long)iVar62 + lVar55 / 86400000000;
                if ((((long)*piVar24 + lVar61 / 0x1e != (long)*piVar36 + lVar58 / 0x1e) ||
                    (lVar61 % 0x1e != lVar58 % 0x1e)) ||
                   (lVar57 % 86400000000 != lVar55 % 86400000000)) goto LAB_00b2ac6f;
              }
            }
            uVar56 = uVar56 + 1;
          } while (count != uVar56);
        }
      }
      else {
        if (count == 0) goto LAB_00b2ba44;
        psVar10 = (sel.ptr)->sel_vector;
        lVar38 = *(long *)local_498;
        psVar11 = *(sel_t **)local_428;
        local_1a0 = (element_type *)0x0;
        local_4b8 = (element_type *)0x0;
        uVar56 = 0;
        do {
          uVar35 = uVar56;
          if (psVar10 != (sel_t *)0x0) {
            uVar35 = (ulong)psVar10[uVar56];
          }
          uVar63 = uVar56;
          if (lVar38 != 0) {
            uVar63 = (ulong)*(uint *)(lVar38 + uVar56 * 4);
          }
          uVar33 = uVar56;
          if (psVar11 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar11[uVar56];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar63 >> 6) * 8) >> (uVar63 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar33 >> 6] >> (uVar33 & 0x3f) & 1)
                     == 0;
          }
          if ((bVar64 | bVar65) == 1) {
            if (bVar64 == bVar65) goto LAB_00b2897d;
LAB_00b2899b:
            peVar32 = local_4b8;
            oVar34.ptr = true_sel.ptr;
            local_4b8 = (element_type *)((long)&local_4b8->_vptr_ExtraTypeInfo + 1);
          }
          else {
            piVar24 = (int *)(LStack_490._0_8_ + uVar63 * 0x10);
            piVar36 = (int *)(LStack_420._0_8_ + uVar33 * 0x10);
            iVar46 = piVar24[1];
            iVar62 = piVar36[1];
            lVar57 = *(long *)(piVar24 + 2);
            lVar55 = *(long *)(piVar36 + 2);
            if (((*piVar24 != *piVar36) || (iVar46 != iVar62)) ||
               (iVar62 = iVar46, lVar57 != lVar55)) {
              lVar61 = (long)iVar46 + lVar57 / 86400000000;
              lVar58 = (long)iVar62 + lVar55 / 86400000000;
              if ((((long)*piVar24 + lVar61 / 0x1e != (long)*piVar36 + lVar58 / 0x1e) ||
                  (lVar61 % 0x1e != lVar58 % 0x1e)) ||
                 (lVar57 % 86400000000 != lVar55 % 86400000000)) goto LAB_00b2899b;
            }
LAB_00b2897d:
            peVar32 = local_1a0;
            oVar34.ptr = false_sel.ptr;
            local_1a0 = (element_type *)((long)&local_1a0->_vptr_ExtraTypeInfo + 1);
          }
          (oVar34.ptr)->sel_vector[(long)peVar32] = (sel_t)uVar35;
          uVar56 = uVar56 + 1;
        } while (count != uVar56);
      }
    }
LAB_00b31195:
    if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
    }
    if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
    }
    if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
    }
LAB_00b33993:
    if ((element_type *)local_478._M_pi != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478._M_pi);
      return (idx_t)local_4b8;
    }
    return (idx_t)local_4b8;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_2a0.ptr = false_sel.ptr;
    local_298.ptr = true_sel.ptr;
    local_290.ptr = sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_290.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&local_118,count);
    OptionalSelection::OptionalSelection(&local_150,&local_118);
    SelectionVector::SelectionVector(&local_130,count);
    OptionalSelection::OptionalSelection(&local_1c0,&local_130);
    SelectionVector::SelectionVector(&local_360,count);
    Vector::Vector(&local_100,left);
    Vector::Vector(&local_98,right);
    optional_ptr<const_duckdb::SelectionVector,_true>::CheckValid(&local_290);
    oVar30.ptr = local_290.ptr;
    local_220.sel = (SelectionVector *)null_mask.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_498);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_428);
    Vector::ToUnifiedFormat(&local_100,count,(UnifiedVectorFormat *)local_498);
    Vector::ToUnifiedFormat(&local_98,count,(UnifiedVectorFormat *)local_428);
    if (LStack_420.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_490.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (count == 0) {
        local_4a8 = 0;
        uVar56 = 0;
      }
      else {
        psVar10 = (oVar30.ptr)->sel_vector;
        local_4a8 = 0;
        iVar39 = 0;
        do {
          sVar54 = (sel_t)iVar39;
          if (psVar10 != (sel_t *)0x0) {
            sVar54 = psVar10[iVar39];
          }
          *(sel_t *)((long)(sel_t **)local_360.sel_vector + iVar39 * 4) = sVar54;
          iVar39 = iVar39 + 1;
          uVar56 = count;
        } while (count != iVar39);
      }
    }
    else {
      SelectionVector::SelectionVector((SelectionVector *)&local_308,count);
      if (count == 0) {
        local_4a8 = 0;
        local_4c8 = 0;
        uVar56 = 0;
      }
      else {
        local_4a8 = 0;
        uVar56 = 0;
        uVar35 = 0;
        local_4c8 = 0;
        do {
          psVar10 = (oVar30.ptr)->sel_vector;
          uVar63 = uVar35;
          if (psVar10 != (sel_t *)0x0) {
            uVar63 = (ulong)psVar10[uVar35];
          }
          uVar33 = uVar35;
          if (*(long *)local_498 != 0) {
            uVar33 = (ulong)*(uint *)(*(long *)local_498 + uVar35 * 4);
          }
          uVar18 = uVar35;
          if (*(sel_t **)local_428 != (sel_t *)0x0) {
            uVar18 = (ulong)(*(sel_t **)local_428)[uVar35];
          }
          if (LStack_490.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar64 = false;
          }
          else {
            bVar64 = (*(ulong *)((long)LStack_490.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar33 >> 6) * 8) >> (uVar33 & 0x3f) & 1) == 0;
          }
          if (LStack_420.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar65 = false;
          }
          else {
            bVar65 = ((ulong)(&(LStack_420.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar18 >> 6] >> (uVar18 & 0x3f) & 1)
                     == 0;
          }
          uVar40 = (undefined4)uVar63;
          if ((bVar64 | bVar65) == 1) {
            if (local_220.sel != (SelectionVector *)0x0) {
              optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                        ((optional_ptr<duckdb::ValidityMask,_true> *)&local_220);
              pSVar17 = local_220.sel;
              _Var19._M_head_impl =
                   ((TemplatedValidityMask<unsigned_long> *)&(local_220.sel)->sel_vector)->
                   validity_mask;
              if (_Var19._M_head_impl == (unsigned_long *)0x0) {
                local_198.sel = (SelectionVector *)local_220.sel[1].sel_vector;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_288,(unsigned_long *)&local_198);
                auVar15 = local_288;
                uVar14 = aLStack_280[0]._0_8_;
                _local_288 = (undefined1  [16])0x0;
                p_Var23 = (pSVar17->selection_data).internal.
                          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                (pSVar17->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)auVar15;
                (pSVar17->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14;
                if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_280[0]._0_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_280[0]._0_8_)
                    ;
                  }
                }
                pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)&pSVar17->selection_data);
                _Var19._M_head_impl =
                     (pTVar31->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                ((TemplatedValidityMask<unsigned_long> *)&pSVar17->sel_vector)->validity_mask =
                     _Var19._M_head_impl;
              }
              bVar12 = (byte)uVar63 & 0x3f;
              _Var19._M_head_impl[uVar63 >> 6] =
                   _Var19._M_head_impl[uVar63 >> 6] &
                   (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
            }
            if (bVar64 == bVar65) {
              if ((OptionalSelection *)local_1c0.sel != (OptionalSelection *)0x0) {
                *(undefined4 *)
                 ((long)&((SelectionVector *)(local_1c0.sel)->sel_vector)->sel_vector +
                 local_4c8 * 4) = uVar40;
              }
              local_4c8 = local_4c8 + 1;
            }
            else {
              if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
                *(undefined4 *)
                 ((long)&((SelectionVector *)(local_150.sel)->sel_vector)->sel_vector +
                 local_4a8 * 4) = uVar40;
              }
              local_4a8 = local_4a8 + 1;
            }
          }
          else {
            *(sel_t *)((long)(_func_int ***)local_308._0_8_ + uVar56 * 4) = (sel_t)uVar35;
            *(undefined4 *)((long)(sel_t **)local_360.sel_vector + uVar56 * 4) = uVar40;
            uVar56 = uVar56 + 1;
          }
          uVar35 = uVar35 + 1;
        } while (count != uVar35);
      }
      pSVar17 = local_150.sel;
      if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
        pSVar4 = (SelectionVector *)(local_150.sel)->sel_vector;
        p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((SelectionVector *)&(local_150.sel)->selection_data)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ((local_150.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ((local_150.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
        }
        pSVar17->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + local_4a8 * 4);
      }
      pSVar17 = local_1c0.sel;
      if ((OptionalSelection *)local_1c0.sel != (OptionalSelection *)0x0) {
        pSVar4 = (SelectionVector *)(local_1c0.sel)->sel_vector;
        p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((SelectionVector *)&(local_1c0.sel)->selection_data)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ((local_1c0.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ((local_1c0.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
        }
        pSVar17->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + local_4c8 * 4);
      }
      if (uVar56 < count && uVar56 != 0) {
        Vector::Slice(&local_100,(SelectionVector *)&local_308,uVar56);
        Vector::Slice(&local_98,(SelectionVector *)&local_308,uVar56);
      }
      if (local_308.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_308.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
    }
    if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
    }
    if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
    }
    if (local_478._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478._M_pi);
    }
    PVar1 = (left->type).physical_type_;
    if (PVar1 == LIST) {
      local_3b0 = (optional_ptr<duckdb::ValidityMask,_true>)
                  (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
      if (uVar56 == 0) goto LAB_00b25f14;
      SelectionVector::SelectionVector(&local_378,uVar56);
      SelectionVector::SelectionVector(&local_390,uVar56);
      pVVar20 = ListVector::GetEntry(&local_100);
      Vector::Vector((Vector *)local_498,pVVar20);
      pVVar20 = ListVector::GetEntry(&local_98);
      Vector::Vector((Vector *)local_428,pVVar20);
      iVar39 = ListVector::GetListSize(&local_100);
      Vector::Flatten((Vector *)local_498,iVar39);
      iVar39 = ListVector::GetListSize(&local_98);
      Vector::Flatten((Vector *)local_428,iVar39);
      Vector::Vector(&local_308,(Vector *)local_498,&local_378,uVar56);
      Vector::Vector((Vector *)local_288,(Vector *)local_428,&local_390,uVar56);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_198);
      Vector::ToUnifiedFormat(&local_100,uVar56,&local_198);
      pdVar9 = local_198.data;
      UnifiedVectorFormat::UnifiedVectorFormat(&local_220);
      Vector::ToUnifiedFormat(&local_98,uVar56,&local_220);
      pdVar7 = local_220.data;
      SelectionVector::SelectionVector(&local_3a8,uVar56);
      auVar13 = _DAT_012acff0;
      lVar38 = uVar56 - 1;
      auVar68._8_4_ = (int)lVar38;
      auVar68._0_8_ = lVar38;
      auVar68._12_4_ = (int)((ulong)lVar38 >> 0x20);
      uVar35 = 0;
      auVar68 = auVar68 ^ _DAT_012acff0;
      auVar70 = _DAT_012acfe0;
      do {
        auVar71 = auVar70 ^ auVar13;
        if ((bool)(~(auVar71._4_4_ == auVar68._4_4_ && auVar68._0_4_ < auVar71._0_4_ ||
                    auVar68._4_4_ < auVar71._4_4_) & 1)) {
          local_3a8.sel_vector[uVar35] = (sel_t)uVar35;
        }
        if ((auVar71._12_4_ != auVar68._12_4_ || auVar71._8_4_ <= auVar68._8_4_) &&
            auVar71._12_4_ <= auVar68._12_4_) {
          local_3a8.sel_vector[uVar35 + 1] = (sel_t)uVar35 + 1;
        }
        uVar35 = uVar35 + 2;
        lVar38 = auVar70._8_8_;
        auVar70._0_8_ = auVar70._0_8_ + 2;
        auVar70._8_8_ = lVar38 + 2;
      } while ((uVar56 + 1 & 0xfffffffffffffffe) != uVar35);
      SelectionVector::SelectionVector((SelectionVector *)(local_348 + 0x28),uVar56);
      SelectionVector::SelectionVector(&local_1d8,uVar56);
      local_348._0_16_ = (undefined1  [16])0x0;
      local_348._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_348._24_8_ = (element_type *)0x800;
      if (local_3b0.ptr == (ValidityMask *)0x0) {
        local_430.ptr = (ValidityMask *)0x0;
      }
      else {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3b0);
        peVar22 = (element_type *)ValidityMask::Capacity(local_3b0.ptr);
        uVar14 = local_348._16_8_;
        local_348._0_16_ = (undefined1  [16])0x0;
        local_348._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14);
        }
        local_430.ptr = (ValidityMask *)local_348;
        local_348._24_8_ = peVar22;
      }
      local_4b8 = (element_type *)0x0;
      lVar38 = 0;
      do {
        pSVar17 = local_150.sel;
        psVar10 = (local_198.sel)->sel_vector;
        uVar35 = 0;
        do {
          uVar63 = uVar35;
          if (local_3a8.sel_vector != (sel_t *)0x0) {
            uVar63 = (ulong)local_3a8.sel_vector[uVar35];
          }
          if (psVar10 != (sel_t *)0x0) {
            uVar63 = (ulong)psVar10[uVar63];
          }
          iVar46 = (int)lVar38;
          local_378.sel_vector[uVar35] = *(int *)((long)local_198.data + uVar63 * 2 * 8) + iVar46;
          uVar35 = uVar35 + 1;
        } while (uVar56 != uVar35);
        puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_220.sel)->sel_vector)->
                 validity_mask;
        uVar35 = 0;
        do {
          uVar63 = uVar35;
          if (local_3a8.sel_vector != (sel_t *)0x0) {
            uVar63 = (ulong)local_3a8.sel_vector[uVar35];
          }
          if (puVar2 != (unsigned_long *)0x0) {
            uVar63 = (ulong)*(uint *)((long)puVar2 + uVar63 * 4);
          }
          *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_390.sel_vector)->
                          validity_mask + uVar35 * 4) =
               *(int *)(local_220.data + uVar63 * 0x10) + iVar46;
          uVar35 = uVar35 + 1;
        } while (uVar56 != uVar35);
        uVar35 = 0;
        uVar63 = 0;
        local_4c8 = 0;
        lVar57 = 0;
        do {
          uVar33 = uVar35;
          if (local_3a8.sel_vector != (sel_t *)0x0) {
            uVar33 = (ulong)local_3a8.sel_vector[uVar35];
          }
          uVar18 = uVar33;
          if (psVar10 != (sel_t *)0x0) {
            uVar18 = (ulong)psVar10[uVar33];
          }
          uVar59 = uVar33;
          if (puVar2 != (unsigned_long *)0x0) {
            uVar59 = (ulong)*(uint *)((long)puVar2 + uVar33 * 4);
          }
          if ((*(long *)((long)pdVar9 + (uVar18 * 2 + 1) * 8) == lVar38) ||
             (*(long *)(pdVar7 + uVar59 * 0x10 + 8) == lVar38)) {
            if ((SelectionVector *)local_360.sel_vector != (SelectionVector *)0x0) {
              uVar33 = (ulong)*(uint *)((long)(sel_t **)local_360.sel_vector + uVar33 * 4);
            }
            if (*(long *)((long)pdVar9 + (uVar18 * 2 + 1) * 8) ==
                *(long *)(pdVar7 + uVar59 * 0x10 + 8)) {
              if ((OptionalSelection *)local_1c0.sel != (OptionalSelection *)0x0) {
                *(int *)((long)&((SelectionVector *)(local_1c0.sel)->sel_vector)->sel_vector +
                        lVar57 * 4) = (int)uVar33;
              }
              lVar57 = lVar57 + 1;
            }
            else {
              if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
                *(int *)((long)&((SelectionVector *)(local_150.sel)->sel_vector)->sel_vector +
                        local_4c8 * 4) = (int)uVar33;
              }
              local_4c8 = local_4c8 + 1;
            }
          }
          else {
            *(int *)(local_348._40_8_ + uVar63 * 4) = (int)uVar33;
            uVar63 = uVar63 + 1;
          }
          uVar35 = uVar35 + 1;
        } while (uVar56 != uVar35);
        if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
          pSVar4 = (SelectionVector *)(local_150.sel)->sel_vector;
          p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((SelectionVector *)&(local_150.sel)->selection_data)->selection_data).internal
                    .super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ((local_150.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          ((local_150.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
          }
          pSVar17->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + local_4c8 * 4);
        }
        pSVar17 = local_1c0.sel;
        if ((OptionalSelection *)local_1c0.sel != (OptionalSelection *)0x0) {
          pSVar4 = (SelectionVector *)(local_1c0.sel)->sel_vector;
          p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((SelectionVector *)&(local_1c0.sel)->selection_data)->selection_data).internal
                    .super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ((local_1c0.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          ((local_1c0.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
          }
          pSVar17->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + lVar57 * 4);
        }
        oVar37.ptr = local_430.ptr;
        if (uVar63 < uVar56) {
          if (uVar63 == 0) {
            uVar56 = 0;
          }
          else {
            uVar56 = 0;
            do {
              sVar54 = (sel_t)uVar56;
              if (local_348._40_8_ != 0) {
                sVar54 = *(sel_t *)(local_348._40_8_ + uVar56 * 4);
              }
              local_3a8.sel_vector[uVar56] = sVar54;
              uVar56 = uVar56 + 1;
            } while (uVar63 != uVar56);
            psVar10 = (local_198.sel)->sel_vector;
            uVar56 = 0;
            do {
              uVar35 = uVar56;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar35 = (ulong)local_3a8.sel_vector[uVar56];
              }
              if (psVar10 != (sel_t *)0x0) {
                uVar35 = (ulong)psVar10[uVar35];
              }
              local_378.sel_vector[uVar56] =
                   *(int *)((long)local_198.data + uVar35 * 2 * 8) + iVar46;
              uVar56 = uVar56 + 1;
            } while (uVar63 != uVar56);
            puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_220.sel)->sel_vector)->
                     validity_mask;
            uVar35 = 0;
            do {
              uVar56 = uVar35;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar56 = (ulong)local_3a8.sel_vector[uVar35];
              }
              if (puVar2 != (unsigned_long *)0x0) {
                uVar56 = (ulong)*(uint *)((long)puVar2 + uVar56 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_390.sel_vector)->
                              validity_mask + uVar35 * 4) =
                   *(int *)(local_220.data + uVar56 * 0x10) + iVar46;
              uVar35 = uVar35 + 1;
              uVar56 = uVar63;
            } while (uVar63 != uVar35);
          }
        }
        iVar39 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                           (&local_308,(Vector *)local_288,&local_3a8,uVar56,
                            (SelectionVector *)(local_348 + 0x28),&local_1d8,local_430);
        ExtractNestedMask(&local_3a8,uVar56,&local_360,oVar37.ptr,local_3b0);
        local_4b8 = (element_type *)(local_4c8 + (long)local_4b8);
        if (iVar39 != 0) {
          oVar30.ptr = (SelectionVector *)(local_348 + 0x28);
          if (uVar56 == iVar39) {
            oVar30.ptr = &local_3a8;
          }
          ExtractNestedSelection
                    ((SelectionVector *)(oVar30.ptr)->sel_vector,iVar39,
                     (SelectionVector *)local_360.sel_vector,(OptionalSelection *)local_150.sel);
          local_4b8 = (element_type *)((long)local_4b8 + iVar39);
          uVar56 = uVar56 - iVar39;
          if (uVar56 == 0) {
            uVar56 = 0;
          }
          else {
            uVar35 = 0;
            do {
              sVar54 = (sel_t)uVar35;
              if (local_1d8.sel_vector != (sel_t *)0x0) {
                sVar54 = local_1d8.sel_vector[uVar35];
              }
              local_3a8.sel_vector[uVar35] = sVar54;
              uVar35 = uVar35 + 1;
            } while (uVar56 != uVar35);
            psVar10 = (local_198.sel)->sel_vector;
            uVar35 = 0;
            do {
              uVar63 = uVar35;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar63 = (ulong)local_3a8.sel_vector[uVar35];
              }
              if (psVar10 != (sel_t *)0x0) {
                uVar63 = (ulong)psVar10[uVar63];
              }
              local_378.sel_vector[uVar35] =
                   *(int *)((long)local_198.data + uVar63 * 2 * 8) + iVar46;
              uVar35 = uVar35 + 1;
            } while (uVar56 != uVar35);
            puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_220.sel)->sel_vector)->
                     validity_mask;
            uVar35 = 0;
            do {
              uVar63 = uVar35;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar63 = (ulong)local_3a8.sel_vector[uVar35];
              }
              if (puVar2 != (unsigned_long *)0x0) {
                uVar63 = (ulong)*(uint *)((long)puVar2 + uVar63 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_390.sel_vector)->
                              validity_mask + uVar35 * 4) =
                   *(int *)(local_220.data + uVar63 * 0x10) + iVar46;
              uVar35 = uVar35 + 1;
            } while (uVar56 != uVar35);
          }
        }
        ExtractNestedMask(&local_3a8,uVar56,&local_360,oVar37.ptr,local_3b0);
        pSVar17 = local_1c0.sel;
        if ((OptionalSelection *)local_1c0.sel != (OptionalSelection *)0x0) {
          pSVar4 = (SelectionVector *)(local_1c0.sel)->sel_vector;
          p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (((SelectionVector *)&(local_1c0.sel)->selection_data)->selection_data).internal
                    .super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          ((local_1c0.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          ((local_1c0.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
          }
          pSVar17->sel_vector = (sel_t *)pSVar4;
        }
        lVar38 = lVar38 + 1;
      } while (uVar56 != 0);
LAB_00b2a1d3:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_);
      }
      if (local_1d8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_310 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_310);
      }
      if (local_3a8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3a8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_220.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_220.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_220.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_220.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_198.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
      }
      if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_pi);
      }
      if (local_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_288 + 8));
      if (local_308.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_308.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_308.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_308.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_308.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_308.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_308 + 8));
      if (local_3c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8._M_pi);
      }
      if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
      }
      if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_428 + 8));
      if (local_438._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_438._M_pi);
      }
      if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
      }
      if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_498 + 8));
      if (local_390.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_390.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_378.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_378.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    else {
      if (PVar1 == STRUCT) {
        local_390.sel_vector = (sel_t *)null_mask.ptr;
        if (uVar56 != 0) {
          _local_288 = (undefined1  [16])0x0;
          aLStack_280[0].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          local_198.sel = (SelectionVector *)0x0;
          local_198.data = (data_ptr_t)0x0;
          this = StructVector::GetEntries(&local_100);
          this_00 = StructVector::GetEntries(&local_98);
          SelectionVector::SelectionVector((SelectionVector *)&local_220,uVar56);
          auVar13 = _DAT_012acff0;
          lVar38 = uVar56 - 1;
          auVar67._8_4_ = (int)lVar38;
          auVar67._0_8_ = lVar38;
          auVar67._12_4_ = (int)((ulong)lVar38 >> 0x20);
          uVar35 = 0;
          auVar67 = auVar67 ^ _DAT_012acff0;
          auVar71 = _DAT_012acfe0;
          do {
            auVar70 = auVar71 ^ auVar13;
            if ((bool)(~(auVar70._4_4_ == auVar67._4_4_ && auVar67._0_4_ < auVar70._0_4_ ||
                        auVar67._4_4_ < auVar70._4_4_) & 1)) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_220.sel)->sel_vector)
                              ->validity_mask + uVar35 * 4) = (int)uVar35;
            }
            if ((auVar70._12_4_ != auVar67._12_4_ || auVar70._8_4_ <= auVar67._8_4_) &&
                auVar70._12_4_ <= auVar67._12_4_) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_220.sel)->sel_vector)
                              ->validity_mask + uVar35 * 4 + 4) = (int)uVar35 + 1;
            }
            uVar35 = uVar35 + 2;
            lVar38 = auVar71._8_8_;
            auVar71._0_8_ = auVar71._0_8_ + 2;
            auVar71._8_8_ = lVar38 + 2;
          } while ((uVar56 + 1 & 0xfffffffffffffffe) != uVar35);
          SelectionVector::SelectionVector((SelectionVector *)local_348,uVar56);
          SelectionVector::SelectionVector(&local_378,uVar56);
          local_308.vector_type = FLAT_VECTOR;
          local_308._1_7_ = 0;
          local_308.type.id_ = INVALID;
          local_308.type.physical_type_ = ~INVALID;
          local_308.type._2_6_ = 0;
          local_308.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_308.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((ValidityMask *)local_390.sel_vector == (ValidityMask *)0x0) {
            oVar37.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                      ((optional_ptr<duckdb::ValidityMask,_true> *)&local_390);
            p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ValidityMask::Capacity((ValidityMask *)local_390.sel_vector);
            peVar32 = local_308.type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_308.vector_type = FLAT_VECTOR;
            local_308._1_7_ = 0;
            local_308.type.id_ = INVALID;
            local_308.type.physical_type_ = ~INVALID;
            local_308.type._2_6_ = 0;
            local_308.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if (peVar32 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar32);
            }
            oVar37.ptr = (ValidityMask *)&local_308;
            local_308.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = p_Var23;
          }
          if ((this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_4b8 = (element_type *)0x0;
          }
          else {
            __n = 0;
            local_4b8 = (element_type *)0x0;
            iVar39 = uVar56;
            do {
              pvVar26 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this,__n);
              pVVar27 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar26);
              Vector::Vector((Vector *)local_498,pVVar27);
              Vector::Flatten((Vector *)local_498,uVar56);
              Vector::Slice((Vector *)local_498,(SelectionVector *)&local_220,iVar39);
              pvVar26 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this_00,__n);
              pVVar27 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar26);
              Vector::Vector((Vector *)local_428,pVVar27);
              Vector::Flatten((Vector *)local_428,uVar56);
              Vector::Slice((Vector *)local_428,(SelectionVector *)&local_220,iVar39);
              iVar21 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                 ((Vector *)local_498,(Vector *)local_428,
                                  (SelectionVector *)&local_220,iVar39,(SelectionVector *)local_348,
                                  &local_378,oVar37);
              ExtractNestedMask((SelectionVector *)&local_220,iVar39,&local_360,oVar37.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)local_390.sel_vector);
              if (iVar21 != 0) {
                pUVar28 = (UnifiedVectorFormat *)local_348;
                if (iVar39 == iVar21) {
                  pUVar28 = &local_220;
                }
                ExtractNestedSelection
                          (pUVar28->sel,iVar21,(SelectionVector *)local_360.sel_vector,
                           (OptionalSelection *)local_150.sel);
                iVar39 = iVar39 - iVar21;
                if (iVar39 != 0) {
                  iVar29 = 0;
                  do {
                    sVar54 = (sel_t)iVar29;
                    if (local_378.sel_vector != (sel_t *)0x0) {
                      sVar54 = local_378.sel_vector[iVar29];
                    }
                    *(sel_t *)((long)&((TemplatedValidityMask<unsigned_long> *)
                                      &(local_220.sel)->sel_vector)->validity_mask + iVar29 * 4) =
                         sVar54;
                    iVar29 = iVar29 + 1;
                  } while (iVar39 != iVar29);
                }
                local_4b8 = (element_type *)((long)local_4b8 + iVar21);
              }
              if (__n == ((long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
                iVar21 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                   ((Vector *)local_498,(Vector *)local_428,
                                    (SelectionVector *)&local_220,iVar39,
                                    (SelectionVector *)local_348,&local_378,oVar37);
                ExtractNestedMask((SelectionVector *)&local_220,iVar39,&local_360,oVar37.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_390.sel_vector);
                oVar30.ptr = (SelectionVector *)local_348;
                if (iVar39 - iVar21 == 0) {
                  oVar30.ptr = (SelectionVector *)&local_220;
                }
                ExtractNestedSelection
                          ((SelectionVector *)(oVar30.ptr)->sel_vector,iVar21,
                           (SelectionVector *)local_360.sel_vector,
                           (OptionalSelection *)local_150.sel);
                oVar30.ptr = &local_378;
                if (iVar21 == 0) {
                  oVar30.ptr = (SelectionVector *)&local_220;
                }
                ExtractNestedSelection
                          ((SelectionVector *)(oVar30.ptr)->sel_vector,iVar39 - iVar21,
                           (SelectionVector *)local_360.sel_vector,
                           (OptionalSelection *)local_1c0.sel);
                local_4b8 = (element_type *)((long)local_4b8 + iVar21);
              }
              else {
                ExtractNestedMask((SelectionVector *)&local_220,iVar39,&local_360,oVar37.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_390.sel_vector);
                pSVar17 = local_1c0.sel;
                if ((OptionalSelection *)local_1c0.sel != (OptionalSelection *)0x0) {
                  pSVar4 = (SelectionVector *)(local_1c0.sel)->sel_vector;
                  p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (((SelectionVector *)&(local_1c0.sel)->selection_data)->selection_data).
                            internal.
                            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr;
                  ((local_1c0.sel)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  ((local_1c0.sel)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
                  }
                  pSVar17->sel_vector = (sel_t *)pSVar4;
                }
              }
              if (local_3c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8._M_pi);
              }
              if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
              }
              if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_428 + 8));
              if (local_438._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_438._M_pi);
              }
              if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
              }
              if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_498 + 8));
              __n = __n + 1;
            } while (__n < (ulong)((long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if (local_308.type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_308.type.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          if (local_378.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_378.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_220.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_220.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask);
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&local_198);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)local_288);
          goto LAB_00b2a392;
        }
      }
      else {
        if (PVar1 != ARRAY) {
          this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_498 = (undefined1  [8])&LStack_490.type_info_;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_498,"Unimplemented type for DISTINCT","");
          NotImplementedException::NotImplementedException(this_01,(string *)local_498);
          __cxa_throw(this_01,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_3b0 = (optional_ptr<duckdb::ValidityMask,_true>)
                    (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
        if (uVar56 != 0) {
          iVar39 = ArrayType::GetSize(&local_100.type);
          SelectionVector::SelectionVector(&local_378,uVar56);
          SelectionVector::SelectionVector(&local_390,uVar56);
          pVVar20 = ArrayVector::GetEntry(&local_100);
          Vector::Vector((Vector *)local_498,pVVar20);
          pVVar20 = ArrayVector::GetEntry(&local_98);
          Vector::Vector((Vector *)local_428,pVVar20);
          iVar21 = ArrayVector::GetTotalSize(&local_100);
          Vector::Flatten((Vector *)local_498,iVar21);
          iVar21 = ArrayVector::GetTotalSize(&local_98);
          Vector::Flatten((Vector *)local_428,iVar21);
          Vector::Vector(&local_308,(Vector *)local_498,&local_378,uVar56);
          Vector::Vector((Vector *)local_288,(Vector *)local_428,&local_390,uVar56);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_198);
          Vector::ToUnifiedFormat(&local_100,uVar56,&local_198);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_220);
          Vector::ToUnifiedFormat(&local_98,uVar56,&local_220);
          SelectionVector::SelectionVector(&local_3a8,uVar56);
          auVar13 = _DAT_012acff0;
          lVar38 = uVar56 - 1;
          auVar66._8_4_ = (int)lVar38;
          auVar66._0_8_ = lVar38;
          auVar66._12_4_ = (int)((ulong)lVar38 >> 0x20);
          uVar35 = 0;
          auVar66 = auVar66 ^ _DAT_012acff0;
          auVar69 = _DAT_012acfe0;
          do {
            auVar70 = auVar69 ^ auVar13;
            if ((bool)(~(auVar70._4_4_ == auVar66._4_4_ && auVar66._0_4_ < auVar70._0_4_ ||
                        auVar66._4_4_ < auVar70._4_4_) & 1)) {
              local_3a8.sel_vector[uVar35] = (sel_t)uVar35;
            }
            if ((auVar70._12_4_ != auVar66._12_4_ || auVar70._8_4_ <= auVar66._8_4_) &&
                auVar70._12_4_ <= auVar66._12_4_) {
              local_3a8.sel_vector[uVar35 + 1] = (sel_t)uVar35 + 1;
            }
            uVar35 = uVar35 + 2;
            lVar38 = auVar69._8_8_;
            auVar69._0_8_ = auVar69._0_8_ + 2;
            auVar69._8_8_ = lVar38 + 2;
          } while ((uVar56 + 1 & 0xfffffffffffffffe) != uVar35);
          SelectionVector::SelectionVector((SelectionVector *)(local_348 + 0x28),uVar56);
          SelectionVector::SelectionVector(&local_1d8,uVar56);
          local_348._0_16_ = (undefined1  [16])0x0;
          local_348._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_348._24_8_ = (element_type *)0x800;
          if (local_3b0.ptr == (ValidityMask *)0x0) {
            oVar37.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3b0);
            peVar22 = (element_type *)ValidityMask::Capacity(local_3b0.ptr);
            uVar14 = local_348._16_8_;
            local_348._0_16_ = (undefined1  [16])0x0;
            local_348._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14);
            }
            oVar37.ptr = (ValidityMask *)local_348;
            local_348._24_8_ = peVar22;
          }
          iVar21 = 0;
          local_4b8 = (element_type *)0x0;
          do {
            pSVar17 = local_150.sel;
            psVar10 = (local_198.sel)->sel_vector;
            uVar35 = 0;
            do {
              uVar63 = uVar35;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar63 = (ulong)local_3a8.sel_vector[uVar35];
              }
              if (psVar10 != (sel_t *)0x0) {
                uVar63 = (ulong)psVar10[uVar63];
              }
              iVar62 = (int)iVar39;
              iVar46 = (int)iVar21;
              local_378.sel_vector[uVar35] = (int)uVar63 * iVar62 + iVar46;
              uVar35 = uVar35 + 1;
            } while (uVar56 != uVar35);
            puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_220.sel)->sel_vector)->
                     validity_mask;
            uVar35 = 0;
            do {
              uVar63 = uVar35;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar63 = (ulong)local_3a8.sel_vector[uVar35];
              }
              if (puVar2 != (unsigned_long *)0x0) {
                uVar63 = (ulong)*(uint *)((long)puVar2 + uVar63 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_390.sel_vector)->
                              validity_mask + uVar35 * 4) = (int)uVar63 * iVar62 + iVar46;
              uVar35 = uVar35 + 1;
            } while (uVar56 != uVar35);
            uVar35 = 0;
            uVar63 = 0;
            lVar38 = 0;
            do {
              uVar33 = uVar35;
              if (local_3a8.sel_vector != (sel_t *)0x0) {
                uVar33 = (ulong)local_3a8.sel_vector[uVar35];
              }
              if (iVar39 == iVar21) {
                if ((SelectionVector *)local_360.sel_vector != (SelectionVector *)0x0) {
                  uVar33 = (ulong)*(uint *)((long)(sel_t **)local_360.sel_vector + uVar33 * 4);
                }
                if ((OptionalSelection *)local_1c0.sel != (OptionalSelection *)0x0) {
                  *(int *)((long)&((SelectionVector *)(local_1c0.sel)->sel_vector)->sel_vector +
                          lVar38 * 4) = (int)uVar33;
                }
                lVar38 = lVar38 + 1;
              }
              else {
                *(int *)(local_348._40_8_ + uVar63 * 4) = (int)uVar33;
                uVar63 = uVar63 + 1;
              }
              uVar35 = uVar35 + 1;
            } while (uVar56 != uVar35);
            if ((OptionalSelection *)local_150.sel != (OptionalSelection *)0x0) {
              pSVar4 = (SelectionVector *)(local_150.sel)->sel_vector;
              p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (((SelectionVector *)&(local_150.sel)->selection_data)->selection_data).
                        internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              ((local_150.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              ((local_150.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
              }
              pSVar17->sel_vector = (sel_t *)pSVar4;
            }
            pSVar17 = local_1c0.sel;
            if ((OptionalSelection *)local_1c0.sel != (OptionalSelection *)0x0) {
              pSVar4 = (SelectionVector *)(local_1c0.sel)->sel_vector;
              p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (((SelectionVector *)&(local_1c0.sel)->selection_data)->selection_data).
                        internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              ((local_1c0.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              ((local_1c0.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
              }
              pSVar17->sel_vector = (sel_t *)((long)&pSVar4->sel_vector + lVar38 * 4);
            }
            if (uVar63 < uVar56) {
              if (uVar63 == 0) {
                uVar56 = 0;
              }
              else {
                uVar56 = 0;
                do {
                  sVar54 = (sel_t)uVar56;
                  if (local_348._40_8_ != 0) {
                    sVar54 = *(sel_t *)(local_348._40_8_ + uVar56 * 4);
                  }
                  local_3a8.sel_vector[uVar56] = sVar54;
                  uVar56 = uVar56 + 1;
                } while (uVar63 != uVar56);
                psVar10 = (local_198.sel)->sel_vector;
                uVar56 = 0;
                do {
                  uVar35 = uVar56;
                  if (local_3a8.sel_vector != (sel_t *)0x0) {
                    uVar35 = (ulong)local_3a8.sel_vector[uVar56];
                  }
                  if (psVar10 != (sel_t *)0x0) {
                    uVar35 = (ulong)psVar10[uVar35];
                  }
                  local_378.sel_vector[uVar56] = (int)uVar35 * iVar62 + iVar46;
                  uVar56 = uVar56 + 1;
                } while (uVar63 != uVar56);
                puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_220.sel)->sel_vector)->
                         validity_mask;
                uVar35 = 0;
                do {
                  uVar56 = uVar35;
                  if (local_3a8.sel_vector != (sel_t *)0x0) {
                    uVar56 = (ulong)local_3a8.sel_vector[uVar35];
                  }
                  if (puVar2 != (unsigned_long *)0x0) {
                    uVar56 = (ulong)*(uint *)((long)puVar2 + uVar56 * 4);
                  }
                  *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_390.sel_vector)->
                                  validity_mask + uVar35 * 4) = (int)uVar56 * iVar62 + iVar46;
                  uVar35 = uVar35 + 1;
                  uVar56 = uVar63;
                } while (uVar63 != uVar35);
              }
            }
            iVar29 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                               (&local_308,(Vector *)local_288,&local_3a8,uVar56,
                                (SelectionVector *)(local_348 + 0x28),&local_1d8,oVar37);
            ExtractNestedMask(&local_3a8,uVar56,&local_360,oVar37.ptr,local_3b0);
            if (iVar29 != 0) {
              oVar30.ptr = (SelectionVector *)(local_348 + 0x28);
              if (uVar56 == iVar29) {
                oVar30.ptr = &local_3a8;
              }
              ExtractNestedSelection
                        ((SelectionVector *)(oVar30.ptr)->sel_vector,iVar29,
                         (SelectionVector *)local_360.sel_vector,(OptionalSelection *)local_150.sel)
              ;
              local_4b8 = (element_type *)((long)local_4b8 + iVar29);
              uVar56 = uVar56 - iVar29;
              if (uVar56 == 0) {
                uVar56 = 0;
              }
              else {
                uVar35 = 0;
                do {
                  sVar54 = (sel_t)uVar35;
                  if (local_1d8.sel_vector != (sel_t *)0x0) {
                    sVar54 = local_1d8.sel_vector[uVar35];
                  }
                  local_3a8.sel_vector[uVar35] = sVar54;
                  uVar35 = uVar35 + 1;
                } while (uVar56 != uVar35);
                psVar10 = (local_198.sel)->sel_vector;
                uVar35 = 0;
                do {
                  uVar63 = uVar35;
                  if (local_3a8.sel_vector != (sel_t *)0x0) {
                    uVar63 = (ulong)local_3a8.sel_vector[uVar35];
                  }
                  if (psVar10 != (sel_t *)0x0) {
                    uVar63 = (ulong)psVar10[uVar63];
                  }
                  local_378.sel_vector[uVar35] = (int)uVar63 * iVar62 + iVar46;
                  uVar35 = uVar35 + 1;
                } while (uVar56 != uVar35);
                puVar2 = ((TemplatedValidityMask<unsigned_long> *)&(local_220.sel)->sel_vector)->
                         validity_mask;
                uVar35 = 0;
                do {
                  uVar63 = uVar35;
                  if (local_3a8.sel_vector != (sel_t *)0x0) {
                    uVar63 = (ulong)local_3a8.sel_vector[uVar35];
                  }
                  if (puVar2 != (unsigned_long *)0x0) {
                    uVar63 = (ulong)*(uint *)((long)puVar2 + uVar63 * 4);
                  }
                  *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_390.sel_vector)->
                                  validity_mask + uVar35 * 4) = (int)uVar63 * iVar62 + iVar46;
                  uVar35 = uVar35 + 1;
                } while (uVar56 != uVar35);
              }
            }
            ExtractNestedMask(&local_3a8,uVar56,&local_360,oVar37.ptr,local_3b0);
            pSVar17 = local_1c0.sel;
            if ((OptionalSelection *)local_1c0.sel != (OptionalSelection *)0x0) {
              pSVar4 = (SelectionVector *)(local_1c0.sel)->sel_vector;
              p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (((SelectionVector *)&(local_1c0.sel)->selection_data)->selection_data).
                        internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              ;
              ((local_1c0.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              ((local_1c0.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
              }
              pSVar17->sel_vector = (sel_t *)pSVar4;
            }
            iVar21 = iVar21 + 1;
          } while (uVar56 != 0);
          goto LAB_00b2a1d3;
        }
      }
LAB_00b25f14:
      local_4b8 = (element_type *)0x0;
    }
LAB_00b2a392:
    local_4b8 = (element_type *)((long)local_4b8 + local_4a8);
    if ((local_298.ptr != (SelectionVector *)0x0) &&
       (optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_298),
       local_4b8 != (element_type *)0x0)) {
      psVar10 = (local_298.ptr)->sel_vector;
      peVar32 = (element_type *)0x0;
      do {
        sVar54 = (sel_t)peVar32;
        if (local_118.sel_vector != (sel_t *)0x0) {
          sVar54 = local_118.sel_vector[(long)peVar32];
        }
        psVar10[(long)peVar32] = sVar54;
        peVar32 = (element_type *)((long)&peVar32->_vptr_ExtraTypeInfo + 1);
      } while (local_4b8 != peVar32);
    }
    if (local_2a0.ptr != (SelectionVector *)0x0) {
      optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_2a0);
      if ((element_type *)count != local_4b8) {
        psVar10 = (local_2a0.ptr)->sel_vector;
        lVar38 = 0;
        do {
          sVar54 = (sel_t)lVar38;
          if (local_130.sel_vector != (sel_t *)0x0) {
            sVar54 = local_130.sel_vector[lVar38];
          }
          psVar10[lVar38] = sVar54;
          lVar38 = lVar38 + 1;
        } while (count - (long)local_4b8 != lVar38);
      }
    }
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_98.type);
    if (local_100.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_100.type);
    if (local_360.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_360.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_1c0.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c0.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_130.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_150.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    goto LAB_00b30edc;
  }
  if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
  }
joined_r0x00b33b8a:
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  local_118.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_478._M_pi;
  if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
    local_118.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_478._M_pi;
  }
LAB_00b30edc:
  if ((element_type *)
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return (idx_t)local_4b8;
}

Assistant:

static idx_t TemplatedDistinctSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel,
                                              idx_t count, optional_ptr<SelectionVector> true_sel,
                                              optional_ptr<SelectionVector> false_sel,
                                              optional_ptr<ValidityMask> null_mask) {

	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return DistinctSelect<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INT16:
		return DistinctSelect<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT32:
		return DistinctSelect<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT64:
		return DistinctSelect<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT8:
		return DistinctSelect<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT16:
		return DistinctSelect<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT32:
		return DistinctSelect<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT64:
		return DistinctSelect<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::INT128:
		return DistinctSelect<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                                null_mask);
	case PhysicalType::UINT128:
		return DistinctSelect<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::FLOAT:
		return DistinctSelect<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                        null_mask);
	case PhysicalType::DOUBLE:
		return DistinctSelect<double, double, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INTERVAL:
		return DistinctSelect<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::VARCHAR:
		return DistinctSelect<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return DistinctSelectNested<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for distinct selection");
	}
}